

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

void secp256k1_ellswift_elligatorswift_var
               (uchar *u32,secp256k1_fe *t,secp256k1_ge *p,secp256k1_sha256 *hasher)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  undefined1 auVar641 [16];
  undefined1 auVar642 [16];
  undefined1 auVar643 [16];
  undefined1 auVar644 [16];
  undefined1 auVar645 [16];
  undefined1 auVar646 [16];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [16];
  undefined1 auVar659 [16];
  undefined1 auVar660 [16];
  undefined1 auVar661 [16];
  undefined1 auVar662 [16];
  undefined1 auVar663 [16];
  undefined1 auVar664 [16];
  undefined1 auVar665 [16];
  undefined1 auVar666 [16];
  undefined1 auVar667 [16];
  undefined1 auVar668 [16];
  undefined1 auVar669 [16];
  undefined1 auVar670 [16];
  undefined1 auVar671 [16];
  undefined1 auVar672 [16];
  undefined1 auVar673 [16];
  undefined1 auVar674 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar677 [16];
  undefined1 auVar678 [16];
  undefined1 auVar679 [16];
  undefined1 auVar680 [16];
  undefined1 auVar681 [16];
  undefined1 auVar682 [16];
  undefined1 auVar683 [16];
  undefined1 auVar684 [16];
  undefined1 auVar685 [16];
  undefined1 auVar686 [16];
  undefined1 auVar687 [16];
  undefined1 auVar688 [16];
  undefined1 auVar689 [16];
  undefined1 auVar690 [16];
  undefined1 auVar691 [16];
  undefined1 auVar692 [16];
  undefined1 auVar693 [16];
  undefined1 auVar694 [16];
  undefined1 auVar695 [16];
  undefined1 auVar696 [16];
  undefined1 auVar697 [16];
  undefined1 auVar698 [16];
  undefined1 auVar699 [16];
  undefined1 auVar700 [16];
  undefined1 auVar701 [16];
  undefined1 auVar702 [16];
  undefined1 auVar703 [16];
  undefined1 auVar704 [16];
  undefined1 auVar705 [16];
  undefined1 auVar706 [16];
  undefined1 auVar707 [16];
  undefined1 auVar708 [16];
  undefined1 auVar709 [16];
  undefined1 auVar710 [16];
  undefined1 auVar711 [16];
  undefined1 auVar712 [16];
  undefined1 auVar713 [16];
  undefined1 auVar714 [16];
  undefined1 auVar715 [16];
  undefined1 auVar716 [16];
  undefined1 auVar717 [16];
  undefined1 auVar718 [16];
  undefined1 auVar719 [16];
  undefined1 auVar720 [16];
  undefined1 auVar721 [16];
  undefined1 auVar722 [16];
  undefined1 auVar723 [16];
  undefined1 auVar724 [16];
  undefined1 auVar725 [16];
  undefined1 auVar726 [16];
  undefined1 auVar727 [16];
  undefined1 auVar728 [16];
  undefined1 auVar729 [16];
  undefined1 auVar730 [16];
  undefined1 auVar731 [16];
  undefined1 auVar732 [16];
  undefined1 auVar733 [16];
  undefined1 auVar734 [16];
  undefined1 auVar735 [16];
  undefined1 auVar736 [16];
  undefined1 auVar737 [16];
  undefined1 auVar738 [16];
  undefined1 auVar739 [16];
  undefined1 auVar740 [16];
  undefined1 auVar741 [16];
  undefined1 auVar742 [16];
  undefined1 auVar743 [16];
  undefined1 auVar744 [16];
  undefined1 auVar745 [16];
  undefined1 auVar746 [16];
  undefined1 auVar747 [16];
  undefined1 auVar748 [16];
  undefined1 auVar749 [16];
  undefined1 auVar750 [16];
  undefined1 auVar751 [16];
  undefined1 auVar752 [16];
  undefined1 auVar753 [16];
  undefined1 auVar754 [16];
  undefined1 auVar755 [16];
  undefined1 auVar756 [16];
  undefined1 auVar757 [16];
  undefined1 auVar758 [16];
  undefined1 auVar759 [16];
  undefined1 auVar760 [16];
  undefined1 auVar761 [16];
  undefined1 auVar762 [16];
  undefined1 auVar763 [16];
  undefined1 auVar764 [16];
  undefined1 auVar765 [16];
  undefined1 auVar766 [16];
  undefined1 auVar767 [16];
  undefined1 auVar768 [16];
  undefined1 auVar769 [16];
  undefined1 auVar770 [16];
  undefined1 auVar771 [16];
  undefined1 auVar772 [16];
  undefined1 auVar773 [16];
  undefined1 auVar774 [16];
  undefined1 auVar775 [16];
  undefined1 auVar776 [16];
  undefined1 auVar777 [16];
  undefined1 auVar778 [16];
  undefined1 auVar779 [16];
  undefined1 auVar780 [16];
  undefined1 auVar781 [16];
  undefined1 auVar782 [16];
  undefined1 auVar783 [16];
  undefined1 auVar784 [16];
  undefined1 auVar785 [16];
  undefined1 auVar786 [16];
  undefined1 auVar787 [16];
  undefined1 auVar788 [16];
  undefined1 auVar789 [16];
  undefined1 auVar790 [16];
  undefined1 auVar791 [16];
  undefined1 auVar792 [16];
  undefined1 auVar793 [16];
  undefined1 auVar794 [16];
  undefined1 auVar795 [16];
  undefined1 auVar796 [16];
  undefined1 auVar797 [16];
  undefined1 auVar798 [16];
  undefined1 auVar799 [16];
  undefined1 auVar800 [16];
  undefined1 auVar801 [16];
  undefined1 auVar802 [16];
  undefined1 auVar803 [16];
  undefined1 auVar804 [16];
  undefined1 auVar805 [16];
  undefined1 auVar806 [16];
  undefined1 auVar807 [16];
  undefined1 auVar808 [16];
  undefined1 auVar809 [16];
  undefined1 auVar810 [16];
  undefined1 auVar811 [16];
  undefined1 auVar812 [16];
  undefined1 auVar813 [16];
  undefined1 auVar814 [16];
  undefined1 auVar815 [16];
  undefined1 auVar816 [16];
  undefined1 auVar817 [16];
  undefined1 auVar818 [16];
  undefined1 auVar819 [16];
  undefined1 auVar820 [16];
  undefined1 auVar821 [16];
  undefined1 auVar822 [16];
  undefined1 auVar823 [16];
  undefined1 auVar824 [16];
  undefined1 auVar825 [16];
  undefined1 auVar826 [16];
  undefined1 auVar827 [16];
  undefined1 auVar828 [16];
  undefined1 auVar829 [16];
  undefined1 auVar830 [16];
  undefined1 auVar831 [16];
  undefined1 auVar832 [16];
  undefined1 auVar833 [16];
  undefined1 auVar834 [16];
  undefined1 auVar835 [16];
  undefined1 auVar836 [16];
  undefined1 auVar837 [16];
  undefined1 auVar838 [16];
  undefined1 auVar839 [16];
  undefined1 auVar840 [16];
  undefined1 auVar841 [16];
  undefined1 auVar842 [16];
  undefined1 auVar843 [16];
  undefined1 auVar844 [16];
  undefined1 auVar845 [16];
  undefined1 auVar846 [16];
  undefined1 auVar847 [16];
  undefined1 auVar848 [16];
  undefined1 auVar849 [16];
  undefined1 auVar850 [16];
  undefined1 auVar851 [16];
  undefined1 auVar852 [16];
  undefined1 auVar853 [16];
  undefined1 auVar854 [16];
  undefined1 auVar855 [16];
  undefined1 auVar856 [16];
  undefined1 auVar857 [16];
  undefined1 auVar858 [16];
  undefined1 auVar859 [16];
  undefined1 auVar860 [16];
  undefined1 auVar861 [16];
  undefined1 auVar862 [16];
  undefined1 auVar863 [16];
  undefined1 auVar864 [16];
  undefined1 auVar865 [16];
  char cVar866;
  byte bVar867;
  secp256k1_fe *r_00;
  secp256k1_sha256 *hasher_00;
  uchar *a;
  int iVar868;
  ulong uVar869;
  ulong uVar870;
  ulong uVar871;
  ulong uVar872;
  secp256k1_fe *psVar873;
  uint uVar874;
  ulong uVar875;
  ulong uVar876;
  ulong uVar877;
  ulong uVar878;
  ulong uVar879;
  ulong uVar880;
  ulong uVar881;
  ulong uVar882;
  ulong uVar883;
  ulong uVar884;
  ulong uVar885;
  long lVar886;
  uint64_t tmp2;
  uint64_t tmp1;
  secp256k1_fe x;
  uint64_t tmp1_2;
  uint64_t tmp3;
  secp256k1_fe r;
  uchar branch_hash [32];
  secp256k1_fe local_218;
  secp256k1_fe local_1e8;
  uint local_1bc;
  secp256k1_fe local_1b8;
  secp256k1_fe local_188;
  ulong local_158;
  ulong uStack_150;
  ulong local_148;
  ulong uStack_140;
  ulong local_138;
  secp256k1_ge *local_128;
  secp256k1_fe local_120;
  secp256k1_fe *local_f8;
  secp256k1_sha256 *local_f0;
  uchar *local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong uStack_c8;
  ulong local_c0;
  ulong uStack_b8;
  ulong local_b0;
  secp256k1_fe local_a8;
  secp256k1_fe local_80;
  byte local_58 [40];
  
  uVar870 = 0;
  uVar874 = 0;
  local_128 = p;
  local_f8 = t;
  local_f0 = hasher;
  local_e8 = u32;
  do {
    hasher_00 = local_f0;
    if (uVar874 == 0) {
      secp256k1_ellswift_prng(local_58,local_f0,(uint32_t)uVar870);
      uVar874 = 0x40;
      uVar870 = (ulong)((uint32_t)uVar870 + 1);
    }
    a = local_e8;
    cVar866 = (char)uVar874;
    uVar874 = uVar874 - 1;
    bVar867 = local_58[uVar874 >> 1] >> (cVar866 * '\x04' - 4U & 4);
    local_e0 = uVar870;
    secp256k1_ellswift_prng(local_e8,hasher_00,(uint32_t)uVar870);
    secp256k1_fe_impl_set_b32_mod(&local_188,a);
    uVar870 = (local_128->x).n[4];
    local_158 = (uVar870 >> 0x30) * 0x1000003d1 + (local_128->x).n[0];
    uStack_150 = (local_158 >> 0x34) + (local_128->x).n[1];
    local_148 = (uStack_150 >> 0x34) + (local_128->x).n[2];
    uStack_140 = (local_148 >> 0x34) + (local_128->x).n[3];
    local_138 = (uStack_140 >> 0x34) + (uVar870 & 0xffffffffffff);
    local_188.n[0] = (local_188.n[4] >> 0x30) * 0x1000003d1 + local_188.n[0];
    local_188.n[1] = (local_188.n[0] >> 0x34) + local_188.n[1];
    local_188.n[2] = (local_188.n[1] >> 0x34) + local_188.n[2];
    local_188.n[3] = (local_188.n[2] >> 0x34) + local_188.n[3];
    local_188.n[4] = (local_188.n[3] >> 0x34) + (local_188.n[4] & 0xffffffffffff);
    local_158 = local_158 & 0xfffffffffffff;
    uStack_150 = uStack_150 & 0xfffffffffffff;
    local_148 = local_148 & 0xfffffffffffff;
    uStack_140 = uStack_140 & 0xfffffffffffff;
    local_188.n[0] = local_188.n[0] & 0xfffffffffffff;
    local_188.n[1] = local_188.n[1] & 0xfffffffffffff;
    local_188.n[2] = local_188.n[2] & 0xfffffffffffff;
    local_188.n[3] = local_188.n[3] & 0xfffffffffffff;
    local_1bc = (uint)bVar867;
    if ((bVar867 & 2) == 0) {
      local_218.n[0] = 0x5ffff9ffffe91a - (local_188.n[0] + local_158);
      local_218.n[4] = 0x5fffffffffffa - (local_188.n[4] + local_138);
      local_218.n[1] = 0x5ffffffffffffa - (local_188.n[1] + uStack_150);
      local_218.n[2] = 0x5ffffffffffffa - (local_188.n[2] + local_148);
      local_218.n[3] = 0x5ffffffffffffa - (local_188.n[3] + uStack_140);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_218.n[0] * 2;
      auVar411._8_8_ = 0;
      auVar411._0_8_ = local_218.n[3];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_218.n[1] * 2;
      auVar412._8_8_ = 0;
      auVar412._0_8_ = local_218.n[2];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_218.n[4];
      auVar413._8_8_ = 0;
      auVar413._0_8_ = local_218.n[4];
      uVar869 = SUB168(auVar3 * auVar413,0);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar869 & 0xfffffffffffff;
      auVar181 = auVar2 * auVar412 + auVar1 * auVar411 + auVar4 * ZEXT816(0x1000003d10);
      uVar871 = auVar181._0_8_;
      auVar761._8_8_ = 0;
      auVar761._0_8_ = uVar871 >> 0x34 | auVar181._8_8_ << 0xc;
      uVar870 = local_218.n[4] * 2;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_218.n[0];
      auVar414._8_8_ = 0;
      auVar414._0_8_ = uVar870;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_218.n[1] * 2;
      auVar415._8_8_ = 0;
      auVar415._0_8_ = local_218.n[3];
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_218.n[2];
      auVar416._8_8_ = 0;
      auVar416._0_8_ = local_218.n[2];
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar869 >> 0x34 | SUB168(auVar3 * auVar413,8) << 0xc;
      auVar181 = auVar5 * auVar414 + auVar761 + auVar6 * auVar415 + auVar7 * auVar416 +
                 auVar8 * ZEXT816(0x1000003d10);
      uVar872 = auVar181._0_8_;
      auVar762._8_8_ = 0;
      auVar762._0_8_ = uVar872 >> 0x34 | auVar181._8_8_ << 0xc;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_218.n[0];
      auVar417._8_8_ = 0;
      auVar417._0_8_ = local_218.n[0];
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_218.n[1];
      auVar418._8_8_ = 0;
      auVar418._0_8_ = uVar870;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_218.n[2] * 2;
      auVar419._8_8_ = 0;
      auVar419._0_8_ = local_218.n[3];
      auVar181 = auVar10 * auVar418 + auVar762 + auVar11 * auVar419;
      uVar869 = auVar181._0_8_;
      auVar764._8_8_ = 0;
      auVar764._0_8_ = uVar869 >> 0x34 | auVar181._8_8_ << 0xc;
      auVar420._8_8_ = 0;
      auVar420._0_8_ = (uVar869 & 0xfffffffffffff) << 4 | (uVar872 & 0xfffffffffffff) >> 0x30;
      auVar181 = auVar9 * auVar417 + ZEXT816(0x1000003d1) * auVar420;
      uVar875 = auVar181._0_8_;
      uVar869 = uVar875 & 0xfffffffffffff;
      auVar763._8_8_ = 0;
      auVar763._0_8_ = uVar875 >> 0x34 | auVar181._8_8_ << 0xc;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_218.n[0] * 2;
      auVar421._8_8_ = 0;
      auVar421._0_8_ = local_218.n[1];
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_218.n[2];
      auVar422._8_8_ = 0;
      auVar422._0_8_ = uVar870;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_218.n[3];
      auVar423._8_8_ = 0;
      auVar423._0_8_ = local_218.n[3];
      auVar182 = auVar13 * auVar422 + auVar764 + auVar14 * auVar423;
      uVar875 = auVar182._0_8_;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar875 & 0xfffffffffffff;
      auVar181 = auVar12 * auVar421 + auVar763 + auVar15 * ZEXT816(0x1000003d10);
      uVar876 = auVar181._0_8_;
      auVar766._8_8_ = 0;
      auVar766._0_8_ = uVar875 >> 0x34 | auVar182._8_8_ << 0xc;
      uVar875 = uVar876 & 0xfffffffffffff;
      auVar765._8_8_ = 0;
      auVar765._0_8_ = uVar876 >> 0x34 | auVar181._8_8_ << 0xc;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_218.n[0] * 2;
      auVar424._8_8_ = 0;
      auVar424._0_8_ = local_218.n[2];
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_218.n[1];
      auVar425._8_8_ = 0;
      auVar425._0_8_ = local_218.n[1];
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_218.n[3];
      auVar426._8_8_ = 0;
      auVar426._0_8_ = uVar870;
      auVar766 = auVar18 * auVar426 + auVar766;
      uVar876 = auVar766._0_8_;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar876 & 0xfffffffffffff;
      auVar181 = auVar16 * auVar424 + auVar765 + auVar17 * auVar425 +
                 auVar19 * ZEXT816(0x1000003d10);
      uVar877 = auVar181._0_8_;
      uVar870 = uVar877 & 0xfffffffffffff;
      auVar767._8_8_ = 0;
      auVar767._0_8_ = (uVar877 >> 0x34 | auVar181._8_8_ << 0xc) + (uVar871 & 0xfffffffffffff);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar876 >> 0x34 | auVar766._8_8_ << 0xc;
      auVar767 = auVar20 * ZEXT816(0x1000003d10) + auVar767;
      uVar876 = auVar767._0_8_;
      uVar871 = uVar876 & 0xfffffffffffff;
      uVar878 = (uVar876 >> 0x34 | auVar767._8_8_ << 0xc) + (uVar872 & 0xffffffffffff);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_218.n[0];
      auVar427._8_8_ = 0;
      auVar427._0_8_ = uVar871;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_218.n[1];
      auVar428._8_8_ = 0;
      auVar428._0_8_ = uVar870;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_218.n[2];
      auVar429._8_8_ = 0;
      auVar429._0_8_ = uVar875;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_218.n[3];
      auVar430._8_8_ = 0;
      auVar430._0_8_ = uVar869;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_218.n[4];
      auVar431._8_8_ = 0;
      auVar431._0_8_ = uVar878;
      uVar872 = SUB168(auVar25 * auVar431,0);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = uVar872 & 0xfffffffffffff;
      auVar181 = auVar22 * auVar428 + auVar21 * auVar427 + auVar23 * auVar429 + auVar24 * auVar430 +
                 auVar26 * ZEXT816(0x1000003d10);
      uVar876 = auVar181._0_8_;
      auVar768._8_8_ = 0;
      auVar768._0_8_ = uVar876 >> 0x34 | auVar181._8_8_ << 0xc;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_218.n[0];
      auVar432._8_8_ = 0;
      auVar432._0_8_ = uVar878;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_218.n[1];
      auVar433._8_8_ = 0;
      auVar433._0_8_ = uVar871;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_218.n[2];
      auVar434._8_8_ = 0;
      auVar434._0_8_ = uVar870;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_218.n[3];
      auVar435._8_8_ = 0;
      auVar435._0_8_ = uVar875;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_218.n[4];
      auVar436._8_8_ = 0;
      auVar436._0_8_ = uVar869;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = uVar872 >> 0x34 | SUB168(auVar25 * auVar431,8) << 0xc;
      auVar181 = auVar27 * auVar432 + auVar768 + auVar28 * auVar433 + auVar29 * auVar434 +
                 auVar30 * auVar435 + auVar31 * auVar436 + auVar32 * ZEXT816(0x1000003d10);
      uVar872 = auVar181._0_8_;
      auVar769._8_8_ = 0;
      auVar769._0_8_ = uVar872 >> 0x34 | auVar181._8_8_ << 0xc;
      local_b0 = (uVar872 & 0xfffffffffffff) >> 0x30;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_218.n[0];
      auVar437._8_8_ = 0;
      auVar437._0_8_ = uVar869;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_218.n[1];
      auVar438._8_8_ = 0;
      auVar438._0_8_ = uVar878;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_218.n[2];
      auVar439._8_8_ = 0;
      auVar439._0_8_ = uVar871;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_218.n[3];
      auVar440._8_8_ = 0;
      auVar440._0_8_ = uVar870;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = local_218.n[4];
      auVar441._8_8_ = 0;
      auVar441._0_8_ = uVar875;
      auVar181 = auVar34 * auVar438 + auVar769 + auVar35 * auVar439 + auVar36 * auVar440 +
                 auVar37 * auVar441;
      uVar877 = auVar181._0_8_;
      auVar771._8_8_ = 0;
      auVar771._0_8_ = uVar877 >> 0x34 | auVar181._8_8_ << 0xc;
      auVar442._8_8_ = 0;
      auVar442._0_8_ = (uVar877 & 0xfffffffffffff) << 4 | local_b0;
      auVar181 = auVar33 * auVar437 + ZEXT816(0x1000003d1) * auVar442;
      uVar879 = auVar181._0_8_;
      auVar770._8_8_ = 0;
      auVar770._0_8_ = uVar879 >> 0x34 | auVar181._8_8_ << 0xc;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = local_218.n[0];
      auVar443._8_8_ = 0;
      auVar443._0_8_ = uVar875;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = local_218.n[1];
      auVar444._8_8_ = 0;
      auVar444._0_8_ = uVar869;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = local_218.n[2];
      auVar445._8_8_ = 0;
      auVar445._0_8_ = uVar878;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = local_218.n[3];
      auVar446._8_8_ = 0;
      auVar446._0_8_ = uVar871;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = local_218.n[4];
      auVar447._8_8_ = 0;
      auVar447._0_8_ = uVar870;
      auVar182 = auVar40 * auVar445 + auVar771 + auVar41 * auVar446 + auVar42 * auVar447;
      uVar877 = auVar182._0_8_;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar877 & 0xfffffffffffff;
      auVar181 = auVar38 * auVar443 + auVar770 + auVar39 * auVar444 +
                 auVar43 * ZEXT816(0x1000003d10);
      uVar880 = auVar181._0_8_;
      auVar773._8_8_ = 0;
      auVar773._0_8_ = uVar877 >> 0x34 | auVar182._8_8_ << 0xc;
      local_120.n[1] = uVar880 & 0xfffffffffffff;
      auVar772._8_8_ = 0;
      auVar772._0_8_ = uVar880 >> 0x34 | auVar181._8_8_ << 0xc;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = local_218.n[0];
      auVar448._8_8_ = 0;
      auVar448._0_8_ = uVar870;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_218.n[1];
      auVar449._8_8_ = 0;
      auVar449._0_8_ = uVar875;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = local_218.n[2];
      auVar450._8_8_ = 0;
      auVar450._0_8_ = uVar869;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_218.n[3];
      auVar451._8_8_ = 0;
      auVar451._0_8_ = uVar878;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = local_218.n[4];
      auVar452._8_8_ = 0;
      auVar452._0_8_ = uVar871;
      auVar182 = auVar47 * auVar451 + auVar773 + auVar48 * auVar452;
      uVar870 = auVar182._0_8_;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar870 & 0xfffffffffffff;
      auVar181 = auVar44 * auVar448 + auVar772 + auVar45 * auVar449 + auVar46 * auVar450 +
                 auVar49 * ZEXT816(0x1000003d10);
      uVar869 = auVar181._0_8_;
      local_120.n[2] = uVar869 & 0xfffffffffffff;
      auVar774._8_8_ = 0;
      auVar774._0_8_ = (uVar869 >> 0x34 | auVar181._8_8_ << 0xc) + (uVar876 & 0xfffffffffffff);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar870 >> 0x34 | auVar182._8_8_ << 0xc;
      auVar774 = auVar50 * ZEXT816(0x1000003d10) + auVar774;
      uVar870 = auVar774._0_8_;
      local_120.n[3] = uVar870 & 0xfffffffffffff;
      local_120.n[4] = (uVar870 >> 0x34 | auVar774._8_8_ << 0xc) + (uVar872 & 0xffffffffffff);
      local_120.n[0] = (uVar879 & 0xfffffffffffff) + 7;
      iVar868 = secp256k1_fe_impl_is_square_var(&local_120);
      if (iVar868 == 0) {
        auVar51._8_8_ = 0;
        auVar51._0_8_ = local_218.n[0] * 2;
        auVar453._8_8_ = 0;
        auVar453._0_8_ = local_218.n[3];
        auVar52._8_8_ = 0;
        auVar52._0_8_ = local_218.n[1] * 2;
        auVar454._8_8_ = 0;
        auVar454._0_8_ = local_218.n[2];
        auVar53._8_8_ = 0;
        auVar53._0_8_ = local_218.n[4];
        auVar455._8_8_ = 0;
        auVar455._0_8_ = local_218.n[4];
        uVar870 = SUB168(auVar53 * auVar455,0);
        auVar54._8_8_ = 0;
        auVar54._0_8_ = uVar870 & 0xfffffffffffff;
        auVar181 = auVar52 * auVar454 + auVar51 * auVar453 + auVar54 * ZEXT816(0x1000003d10);
        uVar869 = auVar181._0_8_;
        auVar775._8_8_ = 0;
        auVar775._0_8_ = uVar869 >> 0x34 | auVar181._8_8_ << 0xc;
        local_218.n[4] = local_218.n[4] * 2;
        auVar55._8_8_ = 0;
        auVar55._0_8_ = local_218.n[0];
        auVar456._8_8_ = 0;
        auVar456._0_8_ = local_218.n[4];
        auVar56._8_8_ = 0;
        auVar56._0_8_ = local_218.n[1] * 2;
        auVar457._8_8_ = 0;
        auVar457._0_8_ = local_218.n[3];
        auVar57._8_8_ = 0;
        auVar57._0_8_ = local_218.n[2];
        auVar458._8_8_ = 0;
        auVar458._0_8_ = local_218.n[2];
        auVar58._8_8_ = 0;
        auVar58._0_8_ = uVar870 >> 0x34 | SUB168(auVar53 * auVar455,8) << 0xc;
        auVar181 = auVar55 * auVar456 + auVar775 + auVar56 * auVar457 + auVar57 * auVar458 +
                   auVar58 * ZEXT816(0x1000003d10);
        uVar871 = auVar181._0_8_;
        auVar776._8_8_ = 0;
        auVar776._0_8_ = uVar871 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar59._8_8_ = 0;
        auVar59._0_8_ = local_218.n[0];
        auVar459._8_8_ = 0;
        auVar459._0_8_ = local_218.n[0];
        auVar60._8_8_ = 0;
        auVar60._0_8_ = local_218.n[1];
        auVar460._8_8_ = 0;
        auVar460._0_8_ = local_218.n[4];
        auVar61._8_8_ = 0;
        auVar61._0_8_ = local_218.n[2] * 2;
        auVar461._8_8_ = 0;
        auVar461._0_8_ = local_218.n[3];
        auVar181 = auVar60 * auVar460 + auVar776 + auVar61 * auVar461;
        uVar870 = auVar181._0_8_;
        auVar778._8_8_ = 0;
        auVar778._0_8_ = uVar870 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar462._8_8_ = 0;
        auVar462._0_8_ = (uVar870 & 0xfffffffffffff) << 4 | (uVar871 & 0xfffffffffffff) >> 0x30;
        auVar181 = auVar59 * auVar459 + ZEXT816(0x1000003d1) * auVar462;
        uVar872 = auVar181._0_8_;
        auVar777._8_8_ = 0;
        auVar777._0_8_ = uVar872 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar62._8_8_ = 0;
        auVar62._0_8_ = local_218.n[0] * 2;
        auVar463._8_8_ = 0;
        auVar463._0_8_ = local_218.n[1];
        auVar63._8_8_ = 0;
        auVar63._0_8_ = local_218.n[2];
        auVar464._8_8_ = 0;
        auVar464._0_8_ = local_218.n[4];
        auVar64._8_8_ = 0;
        auVar64._0_8_ = local_218.n[3];
        auVar465._8_8_ = 0;
        auVar465._0_8_ = local_218.n[3];
        auVar182 = auVar63 * auVar464 + auVar778 + auVar64 * auVar465;
        uVar870 = auVar182._0_8_;
        auVar65._8_8_ = 0;
        auVar65._0_8_ = uVar870 & 0xfffffffffffff;
        auVar181 = auVar62 * auVar463 + auVar777 + auVar65 * ZEXT816(0x1000003d10);
        uVar876 = auVar181._0_8_;
        auVar780._8_8_ = 0;
        auVar780._0_8_ = uVar870 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar779._8_8_ = 0;
        auVar779._0_8_ = uVar876 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar66._8_8_ = 0;
        auVar66._0_8_ = local_218.n[0] * 2;
        auVar466._8_8_ = 0;
        auVar466._0_8_ = local_218.n[2];
        auVar67._8_8_ = 0;
        auVar67._0_8_ = local_218.n[1];
        auVar467._8_8_ = 0;
        auVar467._0_8_ = local_218.n[1];
        auVar68._8_8_ = 0;
        auVar68._0_8_ = local_218.n[3];
        auVar468._8_8_ = 0;
        auVar468._0_8_ = local_218.n[4];
        auVar780 = auVar68 * auVar468 + auVar780;
        uVar870 = auVar780._0_8_;
        auVar69._8_8_ = 0;
        auVar69._0_8_ = uVar870 & 0xfffffffffffff;
        auVar181 = auVar66 * auVar466 + auVar779 + auVar67 * auVar467 +
                   auVar69 * ZEXT816(0x1000003d10);
        uVar877 = auVar181._0_8_;
        auVar781._8_8_ = 0;
        auVar781._0_8_ = (uVar877 >> 0x34 | auVar181._8_8_ << 0xc) + (uVar869 & 0xfffffffffffff);
        auVar70._8_8_ = 0;
        auVar70._0_8_ = uVar870 >> 0x34 | auVar780._8_8_ << 0xc;
        auVar781 = auVar70 * ZEXT816(0x1000003d10) + auVar781;
        uVar878 = auVar781._0_8_;
        auVar71._8_8_ = 0;
        auVar71._0_8_ = local_158;
        auVar469._8_8_ = 0;
        auVar469._0_8_ = local_188.n[3];
        auVar72._8_8_ = 0;
        auVar72._0_8_ = uStack_150;
        auVar470._8_8_ = 0;
        auVar470._0_8_ = local_188.n[2];
        auVar73._8_8_ = 0;
        auVar73._0_8_ = local_148;
        auVar471._8_8_ = 0;
        auVar471._0_8_ = local_188.n[1];
        auVar74._8_8_ = 0;
        auVar74._0_8_ = uStack_140;
        auVar472._8_8_ = 0;
        auVar472._0_8_ = local_188.n[0];
        auVar75._8_8_ = 0;
        auVar75._0_8_ = local_138;
        auVar473._8_8_ = 0;
        auVar473._0_8_ = local_188.n[4];
        uVar870 = SUB168(auVar75 * auVar473,0);
        auVar76._8_8_ = 0;
        auVar76._0_8_ = uVar870 & 0xfffffffffffff;
        auVar181 = auVar72 * auVar470 + auVar71 * auVar469 + auVar73 * auVar471 + auVar74 * auVar472
                   + auVar76 * ZEXT816(0x1000003d10);
        uVar869 = auVar181._0_8_;
        auVar782._8_8_ = 0;
        auVar782._0_8_ = uVar869 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar77._8_8_ = 0;
        auVar77._0_8_ = local_158;
        auVar474._8_8_ = 0;
        auVar474._0_8_ = local_188.n[4];
        auVar78._8_8_ = 0;
        auVar78._0_8_ = uStack_150;
        auVar475._8_8_ = 0;
        auVar475._0_8_ = local_188.n[3];
        auVar79._8_8_ = 0;
        auVar79._0_8_ = local_148;
        auVar476._8_8_ = 0;
        auVar476._0_8_ = local_188.n[2];
        auVar80._8_8_ = 0;
        auVar80._0_8_ = uStack_140;
        auVar477._8_8_ = 0;
        auVar477._0_8_ = local_188.n[1];
        auVar81._8_8_ = 0;
        auVar81._0_8_ = local_138;
        auVar478._8_8_ = 0;
        auVar478._0_8_ = local_188.n[0];
        auVar82._8_8_ = 0;
        auVar82._0_8_ = uVar870 >> 0x34 | SUB168(auVar75 * auVar473,8) << 0xc;
        auVar181 = auVar77 * auVar474 + auVar782 + auVar78 * auVar475 + auVar79 * auVar476 +
                   auVar80 * auVar477 + auVar81 * auVar478 + auVar82 * ZEXT816(0x1000003d10);
        uVar870 = auVar181._0_8_;
        auVar783._8_8_ = 0;
        auVar783._0_8_ = uVar870 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar83._8_8_ = 0;
        auVar83._0_8_ = local_158;
        auVar479._8_8_ = 0;
        auVar479._0_8_ = local_188.n[0];
        auVar84._8_8_ = 0;
        auVar84._0_8_ = uStack_150;
        auVar480._8_8_ = 0;
        auVar480._0_8_ = local_188.n[4];
        auVar85._8_8_ = 0;
        auVar85._0_8_ = local_148;
        auVar481._8_8_ = 0;
        auVar481._0_8_ = local_188.n[3];
        auVar86._8_8_ = 0;
        auVar86._0_8_ = uStack_140;
        auVar482._8_8_ = 0;
        auVar482._0_8_ = local_188.n[2];
        auVar87._8_8_ = 0;
        auVar87._0_8_ = local_138;
        auVar483._8_8_ = 0;
        auVar483._0_8_ = local_188.n[1];
        auVar181 = auVar84 * auVar480 + auVar783 + auVar85 * auVar481 + auVar86 * auVar482 +
                   auVar87 * auVar483;
        uVar875 = auVar181._0_8_;
        auVar785._8_8_ = 0;
        auVar785._0_8_ = uVar875 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar484._8_8_ = 0;
        auVar484._0_8_ = (uVar875 & 0xfffffffffffff) << 4 | (uVar870 & 0xfffffffffffff) >> 0x30;
        auVar181 = auVar83 * auVar479 + ZEXT816(0x1000003d1) * auVar484;
        uVar879 = auVar181._0_8_;
        auVar784._8_8_ = 0;
        auVar784._0_8_ = uVar879 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar88._8_8_ = 0;
        auVar88._0_8_ = local_158;
        auVar485._8_8_ = 0;
        auVar485._0_8_ = local_188.n[1];
        auVar89._8_8_ = 0;
        auVar89._0_8_ = uStack_150;
        auVar486._8_8_ = 0;
        auVar486._0_8_ = local_188.n[0];
        auVar90._8_8_ = 0;
        auVar90._0_8_ = local_148;
        auVar487._8_8_ = 0;
        auVar487._0_8_ = local_188.n[4];
        auVar91._8_8_ = 0;
        auVar91._0_8_ = uStack_140;
        auVar488._8_8_ = 0;
        auVar488._0_8_ = local_188.n[3];
        auVar92._8_8_ = 0;
        auVar92._0_8_ = local_138;
        auVar489._8_8_ = 0;
        auVar489._0_8_ = local_188.n[2];
        auVar182 = auVar90 * auVar487 + auVar785 + auVar91 * auVar488 + auVar92 * auVar489;
        uVar875 = auVar182._0_8_;
        auVar93._8_8_ = 0;
        auVar93._0_8_ = uVar875 & 0xfffffffffffff;
        auVar181 = auVar88 * auVar485 + auVar784 + auVar89 * auVar486 +
                   auVar93 * ZEXT816(0x1000003d10);
        uVar880 = auVar181._0_8_;
        auVar787._8_8_ = 0;
        auVar787._0_8_ = uVar875 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar786._8_8_ = 0;
        auVar786._0_8_ = uVar880 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar94._8_8_ = 0;
        auVar94._0_8_ = local_158;
        auVar490._8_8_ = 0;
        auVar490._0_8_ = local_188.n[2];
        auVar95._8_8_ = 0;
        auVar95._0_8_ = uStack_150;
        auVar491._8_8_ = 0;
        auVar491._0_8_ = local_188.n[1];
        auVar96._8_8_ = 0;
        auVar96._0_8_ = local_148;
        auVar492._8_8_ = 0;
        auVar492._0_8_ = local_188.n[0];
        auVar97._8_8_ = 0;
        auVar97._0_8_ = uStack_140;
        auVar493._8_8_ = 0;
        auVar493._0_8_ = local_188.n[4];
        auVar98._8_8_ = 0;
        auVar98._0_8_ = local_138;
        auVar494._8_8_ = 0;
        auVar494._0_8_ = local_188.n[3];
        auVar182 = auVar97 * auVar493 + auVar787 + auVar98 * auVar494;
        uVar875 = auVar182._0_8_;
        auVar99._8_8_ = 0;
        auVar99._0_8_ = uVar875 & 0xfffffffffffff;
        auVar181 = auVar94 * auVar490 + auVar786 + auVar95 * auVar491 + auVar96 * auVar492 +
                   auVar99 * ZEXT816(0x1000003d10);
        uVar881 = auVar181._0_8_;
        auVar788._8_8_ = 0;
        auVar788._0_8_ = (uVar881 >> 0x34 | auVar181._8_8_ << 0xc) + (uVar869 & 0xfffffffffffff);
        auVar100._8_8_ = 0;
        auVar100._0_8_ = uVar875 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar788 = auVar100 * ZEXT816(0x1000003d10) + auVar788;
        uVar869 = auVar788._0_8_;
        local_1e8.n[0] =
             (0x3ffffbfffff0bc - (uVar872 & 0xfffffffffffff)) + (uVar879 & 0xfffffffffffff);
        local_1e8.n[1] =
             (0x3ffffffffffffc - (uVar876 & 0xfffffffffffff)) + (uVar880 & 0xfffffffffffff);
        local_1e8.n[2] =
             (0x3ffffffffffffc - (uVar877 & 0xfffffffffffff)) + (uVar881 & 0xfffffffffffff);
        local_1e8.n[3] =
             (0x3ffffffffffffc - (uVar878 & 0xfffffffffffff)) + (uVar869 & 0xfffffffffffff);
        local_1e8.n[4] =
             (0x3fffffffffffc -
             ((uVar878 >> 0x34 | auVar781._8_8_ << 0xc) + (uVar871 & 0xffffffffffff))) +
             (uVar869 >> 0x34 | auVar788._8_8_ << 0xc) + (uVar870 & 0xffffffffffff);
        auVar101._8_8_ = 0;
        auVar101._0_8_ = local_188.n[0] * 2;
        auVar495._8_8_ = 0;
        auVar495._0_8_ = local_188.n[3];
        auVar102._8_8_ = 0;
        auVar102._0_8_ = local_188.n[1] * 2;
        auVar496._8_8_ = 0;
        auVar496._0_8_ = local_188.n[2];
        auVar103._8_8_ = 0;
        auVar103._0_8_ = local_188.n[4];
        auVar497._8_8_ = 0;
        auVar497._0_8_ = local_188.n[4];
        uVar869 = SUB168(auVar103 * auVar497,0);
        auVar104._8_8_ = 0;
        auVar104._0_8_ = uVar869 & 0xfffffffffffff;
        auVar181 = auVar102 * auVar496 + auVar101 * auVar495 + auVar104 * ZEXT816(0x1000003d10);
        uVar871 = auVar181._0_8_;
        auVar789._8_8_ = 0;
        auVar789._0_8_ = uVar871 >> 0x34 | auVar181._8_8_ << 0xc;
        uVar870 = local_188.n[4] * 2;
        auVar105._8_8_ = 0;
        auVar105._0_8_ = local_188.n[0];
        auVar498._8_8_ = 0;
        auVar498._0_8_ = uVar870;
        auVar106._8_8_ = 0;
        auVar106._0_8_ = local_188.n[1] * 2;
        auVar499._8_8_ = 0;
        auVar499._0_8_ = local_188.n[3];
        auVar107._8_8_ = 0;
        auVar107._0_8_ = local_188.n[2];
        auVar500._8_8_ = 0;
        auVar500._0_8_ = local_188.n[2];
        auVar108._8_8_ = 0;
        auVar108._0_8_ = uVar869 >> 0x34 | SUB168(auVar103 * auVar497,8) << 0xc;
        auVar181 = auVar105 * auVar498 + auVar789 + auVar106 * auVar499 + auVar107 * auVar500 +
                   auVar108 * ZEXT816(0x1000003d10);
        uVar872 = auVar181._0_8_;
        auVar790._8_8_ = 0;
        auVar790._0_8_ = uVar872 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar109._8_8_ = 0;
        auVar109._0_8_ = local_188.n[0];
        auVar501._8_8_ = 0;
        auVar501._0_8_ = local_188.n[0];
        auVar110._8_8_ = 0;
        auVar110._0_8_ = local_188.n[1];
        auVar502._8_8_ = 0;
        auVar502._0_8_ = uVar870;
        auVar111._8_8_ = 0;
        auVar111._0_8_ = local_188.n[2] * 2;
        auVar503._8_8_ = 0;
        auVar503._0_8_ = local_188.n[3];
        auVar181 = auVar110 * auVar502 + auVar790 + auVar111 * auVar503;
        uVar869 = auVar181._0_8_;
        auVar792._8_8_ = 0;
        auVar792._0_8_ = uVar869 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar504._8_8_ = 0;
        auVar504._0_8_ = (uVar869 & 0xfffffffffffff) << 4 | (uVar872 & 0xfffffffffffff) >> 0x30;
        auVar181 = auVar109 * auVar501 + ZEXT816(0x1000003d1) * auVar504;
        uVar875 = auVar181._0_8_;
        uVar869 = uVar875 & 0xfffffffffffff;
        auVar791._8_8_ = 0;
        auVar791._0_8_ = uVar875 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar112._8_8_ = 0;
        auVar112._0_8_ = local_188.n[0] * 2;
        auVar505._8_8_ = 0;
        auVar505._0_8_ = local_188.n[1];
        auVar113._8_8_ = 0;
        auVar113._0_8_ = local_188.n[2];
        auVar506._8_8_ = 0;
        auVar506._0_8_ = uVar870;
        auVar114._8_8_ = 0;
        auVar114._0_8_ = local_188.n[3];
        auVar507._8_8_ = 0;
        auVar507._0_8_ = local_188.n[3];
        auVar182 = auVar113 * auVar506 + auVar792 + auVar114 * auVar507;
        uVar875 = auVar182._0_8_;
        auVar115._8_8_ = 0;
        auVar115._0_8_ = uVar875 & 0xfffffffffffff;
        auVar181 = auVar112 * auVar505 + auVar791 + auVar115 * ZEXT816(0x1000003d10);
        uVar876 = auVar181._0_8_;
        auVar794._8_8_ = 0;
        auVar794._0_8_ = uVar875 >> 0x34 | auVar182._8_8_ << 0xc;
        uVar875 = uVar876 & 0xfffffffffffff;
        auVar793._8_8_ = 0;
        auVar793._0_8_ = uVar876 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar116._8_8_ = 0;
        auVar116._0_8_ = local_188.n[0] * 2;
        auVar508._8_8_ = 0;
        auVar508._0_8_ = local_188.n[2];
        auVar117._8_8_ = 0;
        auVar117._0_8_ = local_188.n[1];
        auVar509._8_8_ = 0;
        auVar509._0_8_ = local_188.n[1];
        auVar118._8_8_ = 0;
        auVar118._0_8_ = local_188.n[3];
        auVar510._8_8_ = 0;
        auVar510._0_8_ = uVar870;
        auVar794 = auVar118 * auVar510 + auVar794;
        uVar876 = auVar794._0_8_;
        auVar119._8_8_ = 0;
        auVar119._0_8_ = uVar876 & 0xfffffffffffff;
        auVar181 = auVar116 * auVar508 + auVar793 + auVar117 * auVar509 +
                   auVar119 * ZEXT816(0x1000003d10);
        uVar877 = auVar181._0_8_;
        uVar870 = uVar877 & 0xfffffffffffff;
        auVar795._8_8_ = 0;
        auVar795._0_8_ = (uVar877 >> 0x34 | auVar181._8_8_ << 0xc) + (uVar871 & 0xfffffffffffff);
        auVar120._8_8_ = 0;
        auVar120._0_8_ = uVar876 >> 0x34 | auVar794._8_8_ << 0xc;
        auVar795 = auVar120 * ZEXT816(0x1000003d10) + auVar795;
        uVar876 = auVar795._0_8_;
        uVar871 = uVar876 & 0xfffffffffffff;
        uVar878 = (uVar876 >> 0x34 | auVar795._8_8_ << 0xc) + (uVar872 & 0xffffffffffff);
        auVar121._8_8_ = 0;
        auVar121._0_8_ = local_188.n[0];
        auVar511._8_8_ = 0;
        auVar511._0_8_ = uVar871;
        auVar122._8_8_ = 0;
        auVar122._0_8_ = local_188.n[1];
        auVar512._8_8_ = 0;
        auVar512._0_8_ = uVar870;
        auVar123._8_8_ = 0;
        auVar123._0_8_ = local_188.n[2];
        auVar513._8_8_ = 0;
        auVar513._0_8_ = uVar875;
        auVar124._8_8_ = 0;
        auVar124._0_8_ = local_188.n[3];
        auVar514._8_8_ = 0;
        auVar514._0_8_ = uVar869;
        auVar125._8_8_ = 0;
        auVar125._0_8_ = local_188.n[4];
        auVar515._8_8_ = 0;
        auVar515._0_8_ = uVar878;
        uVar872 = SUB168(auVar125 * auVar515,0);
        auVar126._8_8_ = 0;
        auVar126._0_8_ = uVar872 & 0xfffffffffffff;
        auVar181 = auVar122 * auVar512 + auVar121 * auVar511 + auVar123 * auVar513 +
                   auVar124 * auVar514 + auVar126 * ZEXT816(0x1000003d10);
        uVar876 = auVar181._0_8_;
        auVar796._8_8_ = 0;
        auVar796._0_8_ = uVar876 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar127._8_8_ = 0;
        auVar127._0_8_ = local_188.n[0];
        auVar516._8_8_ = 0;
        auVar516._0_8_ = uVar878;
        auVar128._8_8_ = 0;
        auVar128._0_8_ = local_188.n[1];
        auVar517._8_8_ = 0;
        auVar517._0_8_ = uVar871;
        auVar129._8_8_ = 0;
        auVar129._0_8_ = local_188.n[2];
        auVar518._8_8_ = 0;
        auVar518._0_8_ = uVar870;
        auVar130._8_8_ = 0;
        auVar130._0_8_ = local_188.n[3];
        auVar519._8_8_ = 0;
        auVar519._0_8_ = uVar875;
        auVar131._8_8_ = 0;
        auVar131._0_8_ = local_188.n[4];
        auVar520._8_8_ = 0;
        auVar520._0_8_ = uVar869;
        auVar132._8_8_ = 0;
        auVar132._0_8_ = uVar872 >> 0x34 | SUB168(auVar125 * auVar515,8) << 0xc;
        auVar181 = auVar127 * auVar516 + auVar796 + auVar128 * auVar517 + auVar129 * auVar518 +
                   auVar130 * auVar519 + auVar131 * auVar520 + auVar132 * ZEXT816(0x1000003d10);
        uVar872 = auVar181._0_8_;
        auVar797._8_8_ = 0;
        auVar797._0_8_ = uVar872 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar133._8_8_ = 0;
        auVar133._0_8_ = local_188.n[0];
        auVar521._8_8_ = 0;
        auVar521._0_8_ = uVar869;
        auVar134._8_8_ = 0;
        auVar134._0_8_ = local_188.n[1];
        auVar522._8_8_ = 0;
        auVar522._0_8_ = uVar878;
        auVar135._8_8_ = 0;
        auVar135._0_8_ = local_188.n[2];
        auVar523._8_8_ = 0;
        auVar523._0_8_ = uVar871;
        auVar136._8_8_ = 0;
        auVar136._0_8_ = local_188.n[3];
        auVar524._8_8_ = 0;
        auVar524._0_8_ = uVar870;
        auVar137._8_8_ = 0;
        auVar137._0_8_ = local_188.n[4];
        auVar525._8_8_ = 0;
        auVar525._0_8_ = uVar875;
        auVar181 = auVar134 * auVar522 + auVar797 + auVar135 * auVar523 + auVar136 * auVar524 +
                   auVar137 * auVar525;
        uVar877 = auVar181._0_8_;
        auVar799._8_8_ = 0;
        auVar799._0_8_ = uVar877 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar526._8_8_ = 0;
        auVar526._0_8_ = (uVar877 & 0xfffffffffffff) << 4 | (uVar872 & 0xfffffffffffff) >> 0x30;
        auVar181 = auVar133 * auVar521 + ZEXT816(0x1000003d1) * auVar526;
        uVar879 = auVar181._0_8_;
        auVar798._8_8_ = 0;
        auVar798._0_8_ = uVar879 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar138._8_8_ = 0;
        auVar138._0_8_ = local_188.n[0];
        auVar527._8_8_ = 0;
        auVar527._0_8_ = uVar875;
        auVar139._8_8_ = 0;
        auVar139._0_8_ = local_188.n[1];
        auVar528._8_8_ = 0;
        auVar528._0_8_ = uVar869;
        auVar140._8_8_ = 0;
        auVar140._0_8_ = local_188.n[2];
        auVar529._8_8_ = 0;
        auVar529._0_8_ = uVar878;
        auVar141._8_8_ = 0;
        auVar141._0_8_ = local_188.n[3];
        auVar530._8_8_ = 0;
        auVar530._0_8_ = uVar871;
        auVar142._8_8_ = 0;
        auVar142._0_8_ = local_188.n[4];
        auVar531._8_8_ = 0;
        auVar531._0_8_ = uVar870;
        auVar182 = auVar140 * auVar529 + auVar799 + auVar141 * auVar530 + auVar142 * auVar531;
        uVar877 = auVar182._0_8_;
        auVar143._8_8_ = 0;
        auVar143._0_8_ = uVar877 & 0xfffffffffffff;
        auVar181 = auVar138 * auVar527 + auVar798 + auVar139 * auVar528 +
                   auVar143 * ZEXT816(0x1000003d10);
        uVar880 = auVar181._0_8_;
        auVar801._8_8_ = 0;
        auVar801._0_8_ = uVar877 >> 0x34 | auVar182._8_8_ << 0xc;
        local_d0 = uVar880 & 0xfffffffffffff;
        auVar800._8_8_ = 0;
        auVar800._0_8_ = uVar880 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar144._8_8_ = 0;
        auVar144._0_8_ = local_188.n[0];
        auVar532._8_8_ = 0;
        auVar532._0_8_ = uVar870;
        auVar145._8_8_ = 0;
        auVar145._0_8_ = local_188.n[1];
        auVar533._8_8_ = 0;
        auVar533._0_8_ = uVar875;
        auVar146._8_8_ = 0;
        auVar146._0_8_ = local_188.n[2];
        auVar534._8_8_ = 0;
        auVar534._0_8_ = uVar869;
        auVar147._8_8_ = 0;
        auVar147._0_8_ = local_188.n[3];
        auVar535._8_8_ = 0;
        auVar535._0_8_ = uVar878;
        auVar148._8_8_ = 0;
        auVar148._0_8_ = local_188.n[4];
        auVar536._8_8_ = 0;
        auVar536._0_8_ = uVar871;
        auVar182 = auVar147 * auVar535 + auVar801 + auVar148 * auVar536;
        uVar870 = auVar182._0_8_;
        auVar149._8_8_ = 0;
        auVar149._0_8_ = uVar870 & 0xfffffffffffff;
        auVar181 = auVar144 * auVar532 + auVar800 + auVar145 * auVar533 + auVar146 * auVar534 +
                   auVar149 * ZEXT816(0x1000003d10);
        uVar869 = auVar181._0_8_;
        uStack_c8 = uVar869 & 0xfffffffffffff;
        auVar802._8_8_ = 0;
        auVar802._0_8_ = (uVar869 >> 0x34 | auVar181._8_8_ << 0xc) + (uVar876 & 0xfffffffffffff);
        auVar150._8_8_ = 0;
        auVar150._0_8_ = uVar870 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar802 = auVar150 * ZEXT816(0x1000003d10) + auVar802;
        uVar870 = auVar802._0_8_;
        local_c0 = uVar870 & 0xfffffffffffff;
        uStack_b8 = (uVar870 >> 0x34 | auVar802._8_8_ << 0xc) + (uVar872 & 0xffffffffffff);
        local_d8 = (uVar879 & 0xfffffffffffff) + 7;
        auVar151._8_8_ = 0;
        auVar151._0_8_ = local_d8;
        auVar537._8_8_ = 0;
        auVar537._0_8_ = local_1e8.n[3];
        auVar152._8_8_ = 0;
        auVar152._0_8_ = local_d0;
        auVar538._8_8_ = 0;
        auVar538._0_8_ = local_1e8.n[2];
        auVar153._8_8_ = 0;
        auVar153._0_8_ = uStack_c8;
        auVar539._8_8_ = 0;
        auVar539._0_8_ = local_1e8.n[1];
        auVar154._8_8_ = 0;
        auVar154._0_8_ = local_c0;
        auVar540._8_8_ = 0;
        auVar540._0_8_ = local_1e8.n[0];
        auVar155._8_8_ = 0;
        auVar155._0_8_ = uStack_b8;
        auVar541._8_8_ = 0;
        auVar541._0_8_ = local_1e8.n[4];
        uVar870 = SUB168(auVar155 * auVar541,0);
        auVar156._8_8_ = 0;
        auVar156._0_8_ = uVar870 & 0xfffffffffffff;
        auVar181 = auVar152 * auVar538 + auVar151 * auVar537 + auVar153 * auVar539 +
                   auVar154 * auVar540 + auVar156 * ZEXT816(0x1000003d10);
        uVar869 = auVar181._0_8_;
        local_120.n[0] = uVar869 & 0xfffffffffffff;
        auVar803._8_8_ = 0;
        auVar803._0_8_ = uVar869 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar157._8_8_ = 0;
        auVar157._0_8_ = local_d8;
        auVar542._8_8_ = 0;
        auVar542._0_8_ = local_1e8.n[4];
        auVar158._8_8_ = 0;
        auVar158._0_8_ = local_d0;
        auVar543._8_8_ = 0;
        auVar543._0_8_ = local_1e8.n[3];
        auVar159._8_8_ = 0;
        auVar159._0_8_ = uStack_c8;
        auVar544._8_8_ = 0;
        auVar544._0_8_ = local_1e8.n[2];
        auVar160._8_8_ = 0;
        auVar160._0_8_ = local_c0;
        auVar545._8_8_ = 0;
        auVar545._0_8_ = local_1e8.n[1];
        auVar161._8_8_ = 0;
        auVar161._0_8_ = uStack_b8;
        auVar546._8_8_ = 0;
        auVar546._0_8_ = local_1e8.n[0];
        auVar162._8_8_ = 0;
        auVar162._0_8_ = uVar870 >> 0x34 | SUB168(auVar155 * auVar541,8) << 0xc;
        auVar181 = auVar157 * auVar542 + auVar803 + auVar158 * auVar543 + auVar159 * auVar544 +
                   auVar160 * auVar545 + auVar161 * auVar546 + auVar162 * ZEXT816(0x1000003d10);
        uVar870 = auVar181._0_8_;
        auVar804._8_8_ = 0;
        auVar804._0_8_ = uVar870 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar163._8_8_ = 0;
        auVar163._0_8_ = local_d8;
        auVar547._8_8_ = 0;
        auVar547._0_8_ = local_1e8.n[0];
        auVar164._8_8_ = 0;
        auVar164._0_8_ = local_d0;
        auVar548._8_8_ = 0;
        auVar548._0_8_ = local_1e8.n[4];
        auVar165._8_8_ = 0;
        auVar165._0_8_ = uStack_c8;
        auVar549._8_8_ = 0;
        auVar549._0_8_ = local_1e8.n[3];
        auVar166._8_8_ = 0;
        auVar166._0_8_ = local_c0;
        auVar550._8_8_ = 0;
        auVar550._0_8_ = local_1e8.n[2];
        auVar167._8_8_ = 0;
        auVar167._0_8_ = uStack_b8;
        auVar551._8_8_ = 0;
        auVar551._0_8_ = local_1e8.n[1];
        auVar181 = auVar164 * auVar548 + auVar804 + auVar165 * auVar549 + auVar166 * auVar550 +
                   auVar167 * auVar551;
        uVar869 = auVar181._0_8_;
        auVar806._8_8_ = 0;
        auVar806._0_8_ = uVar869 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar552._8_8_ = 0;
        auVar552._0_8_ = (uVar869 & 0xfffffffffffff) << 4 | (uVar870 & 0xfffffffffffff) >> 0x30;
        auVar181 = auVar163 * auVar547 + ZEXT816(0x1000003d1) * auVar552;
        uVar869 = auVar181._0_8_;
        local_218.n[0] = uVar869 & 0xfffffffffffff;
        auVar805._8_8_ = 0;
        auVar805._0_8_ = uVar869 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar168._8_8_ = 0;
        auVar168._0_8_ = local_d8;
        auVar553._8_8_ = 0;
        auVar553._0_8_ = local_1e8.n[1];
        auVar169._8_8_ = 0;
        auVar169._0_8_ = local_d0;
        auVar554._8_8_ = 0;
        auVar554._0_8_ = local_1e8.n[0];
        auVar170._8_8_ = 0;
        auVar170._0_8_ = uStack_c8;
        auVar555._8_8_ = 0;
        auVar555._0_8_ = local_1e8.n[4];
        auVar171._8_8_ = 0;
        auVar171._0_8_ = local_c0;
        auVar556._8_8_ = 0;
        auVar556._0_8_ = local_1e8.n[3];
        auVar172._8_8_ = 0;
        auVar172._0_8_ = uStack_b8;
        auVar557._8_8_ = 0;
        auVar557._0_8_ = local_1e8.n[2];
        auVar182 = auVar170 * auVar555 + auVar806 + auVar171 * auVar556 + auVar172 * auVar557;
        uVar869 = auVar182._0_8_;
        auVar173._8_8_ = 0;
        auVar173._0_8_ = uVar869 & 0xfffffffffffff;
        auVar181 = auVar168 * auVar553 + auVar805 + auVar169 * auVar554 +
                   auVar173 * ZEXT816(0x1000003d10);
        uVar875 = auVar181._0_8_;
        auVar808._8_8_ = 0;
        auVar808._0_8_ = uVar869 >> 0x34 | auVar182._8_8_ << 0xc;
        local_218.n[1] = uVar875 & 0xfffffffffffff;
        auVar807._8_8_ = 0;
        auVar807._0_8_ = uVar875 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar174._8_8_ = 0;
        auVar174._0_8_ = local_d8;
        auVar558._8_8_ = 0;
        auVar558._0_8_ = local_1e8.n[2];
        auVar175._8_8_ = 0;
        auVar175._0_8_ = local_d0;
        auVar559._8_8_ = 0;
        auVar559._0_8_ = local_1e8.n[1];
        auVar176._8_8_ = 0;
        auVar176._0_8_ = uStack_c8;
        auVar560._8_8_ = 0;
        auVar560._0_8_ = local_1e8.n[0];
        auVar177._8_8_ = 0;
        auVar177._0_8_ = local_c0;
        auVar561._8_8_ = 0;
        auVar561._0_8_ = local_1e8.n[4];
        auVar178._8_8_ = 0;
        auVar178._0_8_ = uStack_b8;
        auVar562._8_8_ = 0;
        auVar562._0_8_ = local_1e8.n[3];
        auVar182 = auVar177 * auVar561 + auVar808 + auVar178 * auVar562;
        uVar869 = auVar182._0_8_;
        auVar179._8_8_ = 0;
        auVar179._0_8_ = uVar869 & 0xfffffffffffff;
        auVar181 = auVar174 * auVar558 + auVar807 + auVar175 * auVar559 + auVar176 * auVar560 +
                   auVar179 * ZEXT816(0x1000003d10);
        uVar875 = auVar181._0_8_;
        local_218.n[2] = uVar875 & 0xfffffffffffff;
        auVar809._8_8_ = 0;
        auVar809._0_8_ = (uVar875 >> 0x34 | auVar181._8_8_ << 0xc) + local_120.n[0];
        auVar180._8_8_ = 0;
        auVar180._0_8_ = uVar869 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar809 = auVar180 * ZEXT816(0x1000003d10) + auVar809;
        uVar869 = auVar809._0_8_;
        local_218.n[3] = uVar869 & 0xfffffffffffff;
        local_218.n[4] = (uVar869 >> 0x34 | auVar809._8_8_ << 0xc) + (uVar870 & 0xffffffffffff);
        iVar868 = secp256k1_fe_impl_is_square_var(&local_218);
        if (iVar868 != 0) {
          secp256k1_fe_impl_inv_var(&local_1e8,&local_1e8);
          auVar381._8_8_ = 0;
          auVar381._0_8_ = local_d8;
          auVar735._8_8_ = 0;
          auVar735._0_8_ = local_1e8.n[3];
          auVar382._8_8_ = 0;
          auVar382._0_8_ = local_d0;
          auVar736._8_8_ = 0;
          auVar736._0_8_ = local_1e8.n[2];
          auVar383._8_8_ = 0;
          auVar383._0_8_ = uStack_c8;
          auVar737._8_8_ = 0;
          auVar737._0_8_ = local_1e8.n[1];
          auVar384._8_8_ = 0;
          auVar384._0_8_ = local_c0;
          auVar738._8_8_ = 0;
          auVar738._0_8_ = local_1e8.n[0];
          auVar385._8_8_ = 0;
          auVar385._0_8_ = uStack_b8;
          auVar739._8_8_ = 0;
          auVar739._0_8_ = local_1e8.n[4];
          uVar870 = SUB168(auVar385 * auVar739,0);
          auVar386._8_8_ = 0;
          auVar386._0_8_ = uVar870 & 0xfffffffffffff;
          auVar181 = auVar382 * auVar736 + auVar381 * auVar735 + auVar383 * auVar737 +
                     auVar384 * auVar738 + auVar386 * ZEXT816(0x1000003d10);
          uVar869 = auVar181._0_8_;
          local_120.n[0] = uVar869 & 0xfffffffffffff;
          auVar859._8_8_ = 0;
          auVar859._0_8_ = uVar869 >> 0x34 | auVar181._8_8_ << 0xc;
          auVar387._8_8_ = 0;
          auVar387._0_8_ = local_d8;
          auVar740._8_8_ = 0;
          auVar740._0_8_ = local_1e8.n[4];
          auVar388._8_8_ = 0;
          auVar388._0_8_ = local_d0;
          auVar741._8_8_ = 0;
          auVar741._0_8_ = local_1e8.n[3];
          auVar389._8_8_ = 0;
          auVar389._0_8_ = uStack_c8;
          auVar742._8_8_ = 0;
          auVar742._0_8_ = local_1e8.n[2];
          auVar390._8_8_ = 0;
          auVar390._0_8_ = local_c0;
          auVar743._8_8_ = 0;
          auVar743._0_8_ = local_1e8.n[1];
          auVar391._8_8_ = 0;
          auVar391._0_8_ = uStack_b8;
          auVar744._8_8_ = 0;
          auVar744._0_8_ = local_1e8.n[0];
          auVar392._8_8_ = 0;
          auVar392._0_8_ = uVar870 >> 0x34 | SUB168(auVar385 * auVar739,8) << 0xc;
          auVar181 = auVar387 * auVar740 + auVar859 + auVar388 * auVar741 + auVar389 * auVar742 +
                     auVar390 * auVar743 + auVar391 * auVar744 + auVar392 * ZEXT816(0x1000003d10);
          uVar870 = auVar181._0_8_;
          auVar860._8_8_ = 0;
          auVar860._0_8_ = uVar870 >> 0x34 | auVar181._8_8_ << 0xc;
          auVar393._8_8_ = 0;
          auVar393._0_8_ = local_d8;
          auVar745._8_8_ = 0;
          auVar745._0_8_ = local_1e8.n[0];
          auVar394._8_8_ = 0;
          auVar394._0_8_ = local_d0;
          auVar746._8_8_ = 0;
          auVar746._0_8_ = local_1e8.n[4];
          auVar395._8_8_ = 0;
          auVar395._0_8_ = uStack_c8;
          auVar747._8_8_ = 0;
          auVar747._0_8_ = local_1e8.n[3];
          auVar396._8_8_ = 0;
          auVar396._0_8_ = local_c0;
          auVar748._8_8_ = 0;
          auVar748._0_8_ = local_1e8.n[2];
          auVar397._8_8_ = 0;
          auVar397._0_8_ = uStack_b8;
          auVar749._8_8_ = 0;
          auVar749._0_8_ = local_1e8.n[1];
          auVar181 = auVar394 * auVar746 + auVar860 + auVar395 * auVar747 + auVar396 * auVar748 +
                     auVar397 * auVar749;
          uVar869 = auVar181._0_8_;
          auVar862._8_8_ = 0;
          auVar862._0_8_ = uVar869 >> 0x34 | auVar181._8_8_ << 0xc;
          auVar750._8_8_ = 0;
          auVar750._0_8_ = (uVar869 & 0xfffffffffffff) << 4 | (uVar870 & 0xfffffffffffff) >> 0x30;
          uVar875 = auVar291._0_8_;
          auVar291 = auVar393 * auVar745 + ZEXT816(0x1000003d1) * auVar750;
          auVar861._8_8_ = 0;
          auVar861._0_8_ = uVar875 >> 0x34 | auVar291._8_8_ << 0xc;
          auVar398._8_8_ = 0;
          auVar398._0_8_ = local_d8;
          auVar751._8_8_ = 0;
          auVar751._0_8_ = local_1e8.n[1];
          auVar399._8_8_ = 0;
          auVar399._0_8_ = local_d0;
          auVar752._8_8_ = 0;
          auVar752._0_8_ = local_1e8.n[0];
          auVar400._8_8_ = 0;
          auVar400._0_8_ = uStack_c8;
          auVar753._8_8_ = 0;
          auVar753._0_8_ = local_1e8.n[4];
          auVar401._8_8_ = 0;
          auVar401._0_8_ = local_c0;
          auVar754._8_8_ = 0;
          auVar754._0_8_ = local_1e8.n[3];
          auVar402._8_8_ = 0;
          auVar402._0_8_ = uStack_b8;
          auVar755._8_8_ = 0;
          auVar755._0_8_ = local_1e8.n[2];
          auVar182 = auVar400 * auVar753 + auVar862 + auVar401 * auVar754 + auVar402 * auVar755;
          uVar869 = auVar182._0_8_;
          auVar403._8_8_ = 0;
          auVar403._0_8_ = uVar869 & 0xfffffffffffff;
          auVar181 = auVar398 * auVar751 + auVar861 + auVar399 * auVar752 +
                     auVar403 * ZEXT816(0x1000003d10);
          uVar871 = auVar181._0_8_;
          auVar864._8_8_ = 0;
          auVar864._0_8_ = uVar869 >> 0x34 | auVar182._8_8_ << 0xc;
          auVar863._8_8_ = 0;
          auVar863._0_8_ = uVar871 >> 0x34 | auVar181._8_8_ << 0xc;
          auVar404._8_8_ = 0;
          auVar404._0_8_ = local_d8;
          auVar756._8_8_ = 0;
          auVar756._0_8_ = local_1e8.n[2];
          auVar405._8_8_ = 0;
          auVar405._0_8_ = local_d0;
          auVar757._8_8_ = 0;
          auVar757._0_8_ = local_1e8.n[1];
          auVar406._8_8_ = 0;
          auVar406._0_8_ = uStack_c8;
          auVar758._8_8_ = 0;
          auVar758._0_8_ = local_1e8.n[0];
          auVar407._8_8_ = 0;
          auVar407._0_8_ = local_c0;
          auVar759._8_8_ = 0;
          auVar759._0_8_ = local_1e8.n[4];
          auVar408._8_8_ = 0;
          auVar408._0_8_ = uStack_b8;
          auVar760._8_8_ = 0;
          auVar760._0_8_ = local_1e8.n[3];
          auVar182 = auVar407 * auVar759 + auVar864 + auVar408 * auVar760;
          uVar869 = auVar182._0_8_;
          auVar409._8_8_ = 0;
          auVar409._0_8_ = uVar869 & 0xfffffffffffff;
          auVar181 = auVar404 * auVar756 + auVar863 + auVar405 * auVar757 + auVar406 * auVar758 +
                     auVar409 * ZEXT816(0x1000003d10);
          uVar872 = auVar181._0_8_;
          local_1e8.n[2] = uVar872 & 0xfffffffffffff;
          auVar865._8_8_ = 0;
          auVar865._0_8_ = (uVar872 >> 0x34 | auVar181._8_8_ << 0xc) + local_120.n[0];
          auVar410._8_8_ = 0;
          auVar410._0_8_ = uVar869 >> 0x34 | auVar182._8_8_ << 0xc;
          auVar865 = auVar410 * ZEXT816(0x1000003d10) + auVar865;
          uVar869 = auVar865._0_8_;
          local_1e8.n[3] = uVar869 & 0xfffffffffffff;
          local_1e8.n[4] = (uVar869 >> 0x34 | auVar865._8_8_ << 0xc) + (uVar870 & 0xffffffffffff);
          local_a8.n[0] = local_158;
          local_a8.n[1] = uStack_150;
          local_a8.n[2] = local_148;
          local_a8.n[3] = uStack_140;
          local_a8.n[4] = local_138;
          local_1e8.n[0] = uVar875 & 0xfffffffffffff;
          local_1e8.n[1] = uVar871 & 0xfffffffffffff;
LAB_001117a5:
          secp256k1_fe_sqrt(&local_218,&local_1e8);
          r_00 = local_f8;
          if (((local_1bc & 5) == 5) || ((local_1bc & 5) == 0)) {
            local_218.n[0] = 0x3ffffbfffff0bc - local_218.n[0];
            local_218.n[1] = 0x3ffffffffffffc - local_218.n[1];
            local_218.n[2] = 0x3ffffffffffffc - local_218.n[2];
            local_218.n[3] = 0x3ffffffffffffc - local_218.n[3];
            local_218.n[4] = 0x3fffffffffffc - local_218.n[4];
          }
          psVar873 = &secp256k1_ellswift_c4;
          if ((local_1bc & 1) == 0) {
            psVar873 = &secp256k1_ellswift_c3;
          }
          auVar321._8_8_ = 0;
          auVar321._0_8_ = psVar873->n[0];
          auVar683._8_8_ = 0;
          auVar683._0_8_ = local_188.n[3];
          auVar322._8_8_ = 0;
          auVar322._0_8_ = psVar873->n[1];
          auVar684._8_8_ = 0;
          auVar684._0_8_ = local_188.n[2];
          auVar323._8_8_ = 0;
          auVar323._0_8_ = psVar873->n[2];
          auVar685._8_8_ = 0;
          auVar685._0_8_ = local_188.n[1];
          auVar324._8_8_ = 0;
          auVar324._0_8_ = psVar873->n[3];
          auVar686._8_8_ = 0;
          auVar686._0_8_ = local_188.n[0];
          auVar325._8_8_ = 0;
          auVar325._0_8_ = psVar873->n[4];
          auVar687._8_8_ = 0;
          auVar687._0_8_ = local_188.n[4];
          uVar870 = SUB168(auVar325 * auVar687,0);
          auVar326._8_8_ = 0;
          auVar326._0_8_ = uVar870 & 0xfffffffffffff;
          auVar291 = auVar322 * auVar684 + auVar321 * auVar683 + auVar323 * auVar685 +
                     auVar324 * auVar686 + auVar326 * ZEXT816(0x1000003d10);
          uVar869 = auVar291._0_8_;
          auVar845._8_8_ = 0;
          auVar845._0_8_ = uVar869 >> 0x34 | auVar291._8_8_ << 0xc;
          auVar327._8_8_ = 0;
          auVar327._0_8_ = psVar873->n[0];
          auVar688._8_8_ = 0;
          auVar688._0_8_ = local_188.n[4];
          auVar328._8_8_ = 0;
          auVar328._0_8_ = psVar873->n[1];
          auVar689._8_8_ = 0;
          auVar689._0_8_ = local_188.n[3];
          auVar329._8_8_ = 0;
          auVar329._0_8_ = psVar873->n[2];
          auVar690._8_8_ = 0;
          auVar690._0_8_ = local_188.n[2];
          auVar330._8_8_ = 0;
          auVar330._0_8_ = psVar873->n[3];
          auVar691._8_8_ = 0;
          auVar691._0_8_ = local_188.n[1];
          auVar331._8_8_ = 0;
          auVar331._0_8_ = psVar873->n[4];
          auVar692._8_8_ = 0;
          auVar692._0_8_ = local_188.n[0];
          auVar332._8_8_ = 0;
          auVar332._0_8_ = uVar870 >> 0x34 | SUB168(auVar325 * auVar687,8) << 0xc;
          auVar291 = auVar327 * auVar688 + auVar845 + auVar328 * auVar689 + auVar329 * auVar690 +
                     auVar330 * auVar691 + auVar331 * auVar692 + auVar332 * ZEXT816(0x1000003d10);
          uVar870 = auVar291._0_8_;
          auVar846._8_8_ = 0;
          auVar846._0_8_ = uVar870 >> 0x34 | auVar291._8_8_ << 0xc;
          auVar333._8_8_ = 0;
          auVar333._0_8_ = psVar873->n[0];
          auVar693._8_8_ = 0;
          auVar693._0_8_ = local_188.n[0];
          auVar334._8_8_ = 0;
          auVar334._0_8_ = psVar873->n[1];
          auVar694._8_8_ = 0;
          auVar694._0_8_ = local_188.n[4];
          auVar335._8_8_ = 0;
          auVar335._0_8_ = psVar873->n[2];
          auVar695._8_8_ = 0;
          auVar695._0_8_ = local_188.n[3];
          auVar336._8_8_ = 0;
          auVar336._0_8_ = psVar873->n[3];
          auVar696._8_8_ = 0;
          auVar696._0_8_ = local_188.n[2];
          auVar337._8_8_ = 0;
          auVar337._0_8_ = psVar873->n[4];
          auVar697._8_8_ = 0;
          auVar697._0_8_ = local_188.n[1];
          auVar291 = auVar334 * auVar694 + auVar846 + auVar335 * auVar695 + auVar336 * auVar696 +
                     auVar337 * auVar697;
          uVar875 = auVar291._0_8_;
          auVar848._8_8_ = 0;
          auVar848._0_8_ = uVar875 >> 0x34 | auVar291._8_8_ << 0xc;
          auVar698._8_8_ = 0;
          auVar698._0_8_ = (uVar875 & 0xfffffffffffff) << 4 | (uVar870 & 0xfffffffffffff) >> 0x30;
          auVar291 = auVar333 * auVar693 + ZEXT816(0x1000003d1) * auVar698;
          uVar871 = auVar291._0_8_;
          auVar847._8_8_ = 0;
          auVar847._0_8_ = uVar871 >> 0x34 | auVar291._8_8_ << 0xc;
          auVar338._8_8_ = 0;
          auVar338._0_8_ = psVar873->n[0];
          auVar699._8_8_ = 0;
          auVar699._0_8_ = local_188.n[1];
          auVar339._8_8_ = 0;
          auVar339._0_8_ = psVar873->n[1];
          auVar700._8_8_ = 0;
          auVar700._0_8_ = local_188.n[0];
          auVar340._8_8_ = 0;
          auVar340._0_8_ = psVar873->n[2];
          auVar701._8_8_ = 0;
          auVar701._0_8_ = local_188.n[4];
          auVar341._8_8_ = 0;
          auVar341._0_8_ = psVar873->n[3];
          auVar702._8_8_ = 0;
          auVar702._0_8_ = local_188.n[3];
          auVar342._8_8_ = 0;
          auVar342._0_8_ = psVar873->n[4];
          auVar703._8_8_ = 0;
          auVar703._0_8_ = local_188.n[2];
          auVar181 = auVar340 * auVar701 + auVar848 + auVar341 * auVar702 + auVar342 * auVar703;
          uVar875 = auVar181._0_8_;
          auVar343._8_8_ = 0;
          auVar343._0_8_ = uVar875 & 0xfffffffffffff;
          auVar291 = auVar338 * auVar699 + auVar847 + auVar339 * auVar700 +
                     auVar343 * ZEXT816(0x1000003d10);
          uVar872 = auVar291._0_8_;
          auVar850._8_8_ = 0;
          auVar850._0_8_ = uVar875 >> 0x34 | auVar181._8_8_ << 0xc;
          auVar849._8_8_ = 0;
          auVar849._0_8_ = uVar872 >> 0x34 | auVar291._8_8_ << 0xc;
          auVar344._8_8_ = 0;
          auVar344._0_8_ = psVar873->n[0];
          auVar704._8_8_ = 0;
          auVar704._0_8_ = local_188.n[2];
          auVar345._8_8_ = 0;
          auVar345._0_8_ = psVar873->n[1];
          auVar705._8_8_ = 0;
          auVar705._0_8_ = local_188.n[1];
          auVar346._8_8_ = 0;
          auVar346._0_8_ = psVar873->n[2];
          auVar706._8_8_ = 0;
          auVar706._0_8_ = local_188.n[0];
          auVar347._8_8_ = 0;
          auVar347._0_8_ = psVar873->n[3];
          auVar707._8_8_ = 0;
          auVar707._0_8_ = local_188.n[4];
          auVar348._8_8_ = 0;
          auVar348._0_8_ = psVar873->n[4];
          auVar708._8_8_ = 0;
          auVar708._0_8_ = local_188.n[3];
          auVar181 = auVar347 * auVar707 + auVar850 + auVar348 * auVar708;
          uVar875 = auVar181._0_8_;
          auVar349._8_8_ = 0;
          auVar349._0_8_ = uVar875 & 0xfffffffffffff;
          auVar291 = auVar344 * auVar704 + auVar849 + auVar345 * auVar705 + auVar346 * auVar706 +
                     auVar349 * ZEXT816(0x1000003d10);
          uVar876 = auVar291._0_8_;
          auVar851._8_8_ = 0;
          auVar851._0_8_ = (uVar876 >> 0x34 | auVar291._8_8_ << 0xc) + (uVar869 & 0xfffffffffffff);
          auVar350._8_8_ = 0;
          auVar350._0_8_ = uVar875 >> 0x34 | auVar181._8_8_ << 0xc;
          auVar851 = auVar350 * ZEXT816(0x1000003d10) + auVar851;
          uVar869 = auVar851._0_8_;
          local_188.n[0] = (uVar871 & 0xfffffffffffff) + local_a8.n[0];
          local_188.n[1] = (uVar872 & 0xfffffffffffff) + local_a8.n[1];
          local_188.n[2] = (uVar876 & 0xfffffffffffff) + local_a8.n[2];
          local_188.n[3] = (uVar869 & 0xfffffffffffff) + local_a8.n[3];
          local_188.n[4] =
               (uVar869 >> 0x34 | auVar851._8_8_ << 0xc) + (uVar870 & 0xffffffffffff) +
               local_a8.n[4];
          auVar351._8_8_ = 0;
          auVar351._0_8_ = local_188.n[0];
          auVar709._8_8_ = 0;
          auVar709._0_8_ = local_218.n[3];
          auVar352._8_8_ = 0;
          auVar352._0_8_ = local_188.n[1];
          auVar710._8_8_ = 0;
          auVar710._0_8_ = local_218.n[2];
          auVar353._8_8_ = 0;
          auVar353._0_8_ = local_188.n[2];
          auVar711._8_8_ = 0;
          auVar711._0_8_ = local_218.n[1];
          auVar354._8_8_ = 0;
          auVar354._0_8_ = local_188.n[3];
          auVar712._8_8_ = 0;
          auVar712._0_8_ = local_218.n[0];
          auVar355._8_8_ = 0;
          auVar355._0_8_ = local_188.n[4];
          auVar713._8_8_ = 0;
          auVar713._0_8_ = local_218.n[4];
          uVar870 = SUB168(auVar355 * auVar713,0);
          auVar356._8_8_ = 0;
          auVar356._0_8_ = uVar870 & 0xfffffffffffff;
          auVar291 = auVar352 * auVar710 + auVar351 * auVar709 + auVar353 * auVar711 +
                     auVar354 * auVar712 + auVar356 * ZEXT816(0x1000003d10);
          uVar869 = auVar291._0_8_;
          local_120.n[0] = uVar869 & 0xfffffffffffff;
          auVar852._8_8_ = 0;
          auVar852._0_8_ = uVar869 >> 0x34 | auVar291._8_8_ << 0xc;
          auVar357._8_8_ = 0;
          auVar357._0_8_ = local_188.n[0];
          auVar714._8_8_ = 0;
          auVar714._0_8_ = local_218.n[4];
          auVar358._8_8_ = 0;
          auVar358._0_8_ = local_188.n[1];
          auVar715._8_8_ = 0;
          auVar715._0_8_ = local_218.n[3];
          auVar359._8_8_ = 0;
          auVar359._0_8_ = local_188.n[2];
          auVar716._8_8_ = 0;
          auVar716._0_8_ = local_218.n[2];
          auVar360._8_8_ = 0;
          auVar360._0_8_ = local_188.n[3];
          auVar717._8_8_ = 0;
          auVar717._0_8_ = local_218.n[1];
          auVar361._8_8_ = 0;
          auVar361._0_8_ = local_188.n[4];
          auVar718._8_8_ = 0;
          auVar718._0_8_ = local_218.n[0];
          auVar362._8_8_ = 0;
          auVar362._0_8_ = uVar870 >> 0x34 | SUB168(auVar355 * auVar713,8) << 0xc;
          auVar291 = auVar357 * auVar714 + auVar852 + auVar358 * auVar715 + auVar359 * auVar716 +
                     auVar360 * auVar717 + auVar361 * auVar718 + auVar362 * ZEXT816(0x1000003d10);
          uVar870 = auVar291._0_8_;
          auVar853._8_8_ = 0;
          auVar853._0_8_ = uVar870 >> 0x34 | auVar291._8_8_ << 0xc;
          auVar363._8_8_ = 0;
          auVar363._0_8_ = local_188.n[0];
          auVar719._8_8_ = 0;
          auVar719._0_8_ = local_218.n[0];
          auVar364._8_8_ = 0;
          auVar364._0_8_ = local_188.n[1];
          auVar720._8_8_ = 0;
          auVar720._0_8_ = local_218.n[4];
          auVar365._8_8_ = 0;
          auVar365._0_8_ = local_188.n[2];
          auVar721._8_8_ = 0;
          auVar721._0_8_ = local_218.n[3];
          auVar366._8_8_ = 0;
          auVar366._0_8_ = local_188.n[3];
          auVar722._8_8_ = 0;
          auVar722._0_8_ = local_218.n[2];
          auVar367._8_8_ = 0;
          auVar367._0_8_ = local_188.n[4];
          auVar723._8_8_ = 0;
          auVar723._0_8_ = local_218.n[1];
          auVar291 = auVar364 * auVar720 + auVar853 + auVar365 * auVar721 + auVar366 * auVar722 +
                     auVar367 * auVar723;
          uVar869 = auVar291._0_8_;
          auVar855._8_8_ = 0;
          auVar855._0_8_ = uVar869 >> 0x34 | auVar291._8_8_ << 0xc;
          auVar724._8_8_ = 0;
          auVar724._0_8_ = (uVar869 & 0xfffffffffffff) << 4 | (uVar870 & 0xfffffffffffff) >> 0x30;
          auVar291 = auVar363 * auVar719 + ZEXT816(0x1000003d1) * auVar724;
          uVar869 = auVar291._0_8_;
          local_f8->n[0] = uVar869 & 0xfffffffffffff;
          auVar854._8_8_ = 0;
          auVar854._0_8_ = uVar869 >> 0x34 | auVar291._8_8_ << 0xc;
          auVar368._8_8_ = 0;
          auVar368._0_8_ = local_188.n[0];
          auVar725._8_8_ = 0;
          auVar725._0_8_ = local_218.n[1];
          auVar369._8_8_ = 0;
          auVar369._0_8_ = local_188.n[1];
          auVar726._8_8_ = 0;
          auVar726._0_8_ = local_218.n[0];
          auVar370._8_8_ = 0;
          auVar370._0_8_ = local_188.n[2];
          auVar727._8_8_ = 0;
          auVar727._0_8_ = local_218.n[4];
          auVar371._8_8_ = 0;
          auVar371._0_8_ = local_188.n[3];
          auVar728._8_8_ = 0;
          auVar728._0_8_ = local_218.n[3];
          auVar372._8_8_ = 0;
          auVar372._0_8_ = local_188.n[4];
          auVar729._8_8_ = 0;
          auVar729._0_8_ = local_218.n[2];
          auVar181 = auVar370 * auVar727 + auVar855 + auVar371 * auVar728 + auVar372 * auVar729;
          uVar869 = auVar181._0_8_;
          auVar373._8_8_ = 0;
          auVar373._0_8_ = uVar869 & 0xfffffffffffff;
          auVar291 = auVar368 * auVar725 + auVar854 + auVar369 * auVar726 +
                     auVar373 * ZEXT816(0x1000003d10);
          uVar875 = auVar291._0_8_;
          auVar857._8_8_ = 0;
          auVar857._0_8_ = uVar869 >> 0x34 | auVar181._8_8_ << 0xc;
          local_f8->n[1] = uVar875 & 0xfffffffffffff;
          auVar856._8_8_ = 0;
          auVar856._0_8_ = uVar875 >> 0x34 | auVar291._8_8_ << 0xc;
          auVar374._8_8_ = 0;
          auVar374._0_8_ = local_188.n[0];
          auVar730._8_8_ = 0;
          auVar730._0_8_ = local_218.n[2];
          auVar375._8_8_ = 0;
          auVar375._0_8_ = local_188.n[1];
          auVar731._8_8_ = 0;
          auVar731._0_8_ = local_218.n[1];
          auVar376._8_8_ = 0;
          auVar376._0_8_ = local_188.n[2];
          auVar732._8_8_ = 0;
          auVar732._0_8_ = local_218.n[0];
          auVar377._8_8_ = 0;
          auVar377._0_8_ = local_188.n[3];
          auVar733._8_8_ = 0;
          auVar733._0_8_ = local_218.n[4];
          auVar378._8_8_ = 0;
          auVar378._0_8_ = local_188.n[4];
          auVar734._8_8_ = 0;
          auVar734._0_8_ = local_218.n[3];
          auVar181 = auVar377 * auVar733 + auVar857 + auVar378 * auVar734;
          uVar869 = auVar181._0_8_;
          auVar379._8_8_ = 0;
          auVar379._0_8_ = uVar869 & 0xfffffffffffff;
          auVar291 = auVar374 * auVar730 + auVar856 + auVar375 * auVar731 + auVar376 * auVar732 +
                     auVar379 * ZEXT816(0x1000003d10);
          uVar875 = auVar291._0_8_;
          local_f8->n[2] = uVar875 & 0xfffffffffffff;
          auVar858._8_8_ = 0;
          auVar858._0_8_ = (uVar875 >> 0x34 | auVar291._8_8_ << 0xc) + local_120.n[0];
          auVar380._8_8_ = 0;
          auVar380._0_8_ = uVar869 >> 0x34 | auVar181._8_8_ << 0xc;
          auVar858 = auVar380 * ZEXT816(0x1000003d10) + auVar858;
          uVar869 = auVar858._0_8_;
          local_f8->n[3] = uVar869 & 0xfffffffffffff;
          local_f8->n[4] = (uVar869 >> 0x34 | auVar858._8_8_ << 0xc) + (uVar870 & 0xffffffffffff);
          secp256k1_fe_impl_normalize_var(local_f8);
          if ((((uint)(local_128->y).n[0] ^ (uint)r_00->n[0]) & 1) != 0) {
            r_00->n[0] = 0x3ffffbfffff0bc - r_00->n[0];
            r_00->n[1] = 0x3ffffffffffffc - r_00->n[1];
            r_00->n[2] = 0x3ffffffffffffc - r_00->n[2];
            r_00->n[3] = 0x3ffffffffffffc - r_00->n[3];
            r_00->n[4] = 0x3fffffffffffc - r_00->n[4];
            secp256k1_fe_impl_normalize_var(r_00);
          }
          return;
        }
      }
    }
    else {
      local_218.n[0] = 0x3ffffbfffff0bc - local_188.n[0];
      local_218.n[1] = 0x3ffffffffffffc - local_188.n[1];
      local_218.n[2] = 0x3ffffffffffffc - local_188.n[2];
      local_218.n[3] = 0x3ffffffffffffc - local_188.n[3];
      local_218.n[4] = 0x3fffffffffffc - local_188.n[4];
      local_1e8.n[0] = local_218.n[0] + local_158;
      local_1e8.n[1] = local_218.n[1] + uStack_150;
      local_1e8.n[2] = local_218.n[2] + local_148;
      local_1e8.n[3] = local_218.n[3] + uStack_140;
      local_1e8.n[4] = local_218.n[4] + local_138;
      iVar868 = secp256k1_fe_impl_is_square_var(&local_1e8);
      if (iVar868 != 0) {
        auVar181._8_8_ = 0;
        auVar181._0_8_ = local_188.n[0] * 2;
        auVar563._8_8_ = 0;
        auVar563._0_8_ = local_188.n[3];
        auVar182._8_8_ = 0;
        auVar182._0_8_ = local_188.n[1] * 2;
        auVar564._8_8_ = 0;
        auVar564._0_8_ = local_188.n[2];
        auVar183._8_8_ = 0;
        auVar183._0_8_ = local_188.n[4];
        auVar565._8_8_ = 0;
        auVar565._0_8_ = local_188.n[4];
        uVar869 = SUB168(auVar183 * auVar565,0);
        auVar184._8_8_ = 0;
        auVar184._0_8_ = uVar869 & 0xfffffffffffff;
        auVar181 = auVar182 * auVar564 + auVar181 * auVar563 + auVar184 * ZEXT816(0x1000003d10);
        uVar871 = auVar181._0_8_;
        auVar810._8_8_ = 0;
        auVar810._0_8_ = uVar871 >> 0x34 | auVar181._8_8_ << 0xc;
        uVar870 = local_188.n[4] * 2;
        auVar185._8_8_ = 0;
        auVar185._0_8_ = local_188.n[0];
        auVar566._8_8_ = 0;
        auVar566._0_8_ = uVar870;
        auVar186._8_8_ = 0;
        auVar186._0_8_ = local_188.n[1] * 2;
        auVar567._8_8_ = 0;
        auVar567._0_8_ = local_188.n[3];
        auVar187._8_8_ = 0;
        auVar187._0_8_ = local_188.n[2];
        auVar568._8_8_ = 0;
        auVar568._0_8_ = local_188.n[2];
        auVar188._8_8_ = 0;
        auVar188._0_8_ = uVar869 >> 0x34 | SUB168(auVar183 * auVar565,8) << 0xc;
        auVar181 = auVar185 * auVar566 + auVar810 + auVar186 * auVar567 + auVar187 * auVar568 +
                   auVar188 * ZEXT816(0x1000003d10);
        uVar872 = auVar181._0_8_;
        auVar811._8_8_ = 0;
        auVar811._0_8_ = uVar872 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar189._8_8_ = 0;
        auVar189._0_8_ = local_188.n[0];
        auVar569._8_8_ = 0;
        auVar569._0_8_ = local_188.n[0];
        auVar190._8_8_ = 0;
        auVar190._0_8_ = local_188.n[1];
        auVar570._8_8_ = 0;
        auVar570._0_8_ = uVar870;
        auVar191._8_8_ = 0;
        auVar191._0_8_ = local_188.n[2] * 2;
        auVar571._8_8_ = 0;
        auVar571._0_8_ = local_188.n[3];
        auVar181 = auVar190 * auVar570 + auVar811 + auVar191 * auVar571;
        uVar869 = auVar181._0_8_;
        auVar813._8_8_ = 0;
        auVar813._0_8_ = uVar869 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar572._8_8_ = 0;
        auVar572._0_8_ = (uVar869 & 0xfffffffffffff) << 4 | (uVar872 & 0xfffffffffffff) >> 0x30;
        auVar181 = auVar189 * auVar569 + ZEXT816(0x1000003d1) * auVar572;
        uVar875 = auVar181._0_8_;
        uVar869 = uVar875 & 0xfffffffffffff;
        auVar812._8_8_ = 0;
        auVar812._0_8_ = uVar875 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar192._8_8_ = 0;
        auVar192._0_8_ = local_188.n[0] * 2;
        auVar573._8_8_ = 0;
        auVar573._0_8_ = local_188.n[1];
        auVar193._8_8_ = 0;
        auVar193._0_8_ = local_188.n[2];
        auVar574._8_8_ = 0;
        auVar574._0_8_ = uVar870;
        auVar194._8_8_ = 0;
        auVar194._0_8_ = local_188.n[3];
        auVar575._8_8_ = 0;
        auVar575._0_8_ = local_188.n[3];
        auVar182 = auVar193 * auVar574 + auVar813 + auVar194 * auVar575;
        uVar875 = auVar182._0_8_;
        auVar195._8_8_ = 0;
        auVar195._0_8_ = uVar875 & 0xfffffffffffff;
        auVar181 = auVar192 * auVar573 + auVar812 + auVar195 * ZEXT816(0x1000003d10);
        uVar876 = auVar181._0_8_;
        auVar815._8_8_ = 0;
        auVar815._0_8_ = uVar875 >> 0x34 | auVar182._8_8_ << 0xc;
        uVar875 = uVar876 & 0xfffffffffffff;
        auVar814._8_8_ = 0;
        auVar814._0_8_ = uVar876 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar196._8_8_ = 0;
        auVar196._0_8_ = local_188.n[0] * 2;
        auVar576._8_8_ = 0;
        auVar576._0_8_ = local_188.n[2];
        auVar197._8_8_ = 0;
        auVar197._0_8_ = local_188.n[1];
        auVar577._8_8_ = 0;
        auVar577._0_8_ = local_188.n[1];
        auVar198._8_8_ = 0;
        auVar198._0_8_ = local_188.n[3];
        auVar578._8_8_ = 0;
        auVar578._0_8_ = uVar870;
        auVar815 = auVar198 * auVar578 + auVar815;
        uVar876 = auVar815._0_8_;
        auVar199._8_8_ = 0;
        auVar199._0_8_ = uVar876 & 0xfffffffffffff;
        auVar181 = auVar196 * auVar576 + auVar814 + auVar197 * auVar577 +
                   auVar199 * ZEXT816(0x1000003d10);
        uVar877 = auVar181._0_8_;
        uVar870 = uVar877 & 0xfffffffffffff;
        auVar816._8_8_ = 0;
        auVar816._0_8_ = (uVar877 >> 0x34 | auVar181._8_8_ << 0xc) + (uVar871 & 0xfffffffffffff);
        auVar200._8_8_ = 0;
        auVar200._0_8_ = uVar876 >> 0x34 | auVar815._8_8_ << 0xc;
        auVar816 = auVar200 * ZEXT816(0x1000003d10) + auVar816;
        uVar876 = auVar816._0_8_;
        uVar871 = uVar876 & 0xfffffffffffff;
        uVar879 = (uVar876 >> 0x34 | auVar816._8_8_ << 0xc) + (uVar872 & 0xffffffffffff);
        auVar201._8_8_ = 0;
        auVar201._0_8_ = uVar869;
        auVar579._8_8_ = 0;
        auVar579._0_8_ = local_1e8.n[3];
        auVar202._8_8_ = 0;
        auVar202._0_8_ = uVar875;
        auVar580._8_8_ = 0;
        auVar580._0_8_ = local_1e8.n[2];
        auVar203._8_8_ = 0;
        auVar203._0_8_ = uVar870;
        auVar581._8_8_ = 0;
        auVar581._0_8_ = local_1e8.n[1];
        auVar204._8_8_ = 0;
        auVar204._0_8_ = uVar871;
        auVar582._8_8_ = 0;
        auVar582._0_8_ = local_1e8.n[0];
        auVar205._8_8_ = 0;
        auVar205._0_8_ = uVar879;
        auVar583._8_8_ = 0;
        auVar583._0_8_ = local_1e8.n[4];
        uVar872 = SUB168(auVar205 * auVar583,0);
        auVar206._8_8_ = 0;
        auVar206._0_8_ = uVar872 & 0xfffffffffffff;
        auVar181 = auVar202 * auVar580 + auVar201 * auVar579 + auVar203 * auVar581 +
                   auVar204 * auVar582 + auVar206 * ZEXT816(0x1000003d10);
        uVar876 = auVar181._0_8_;
        auVar817._8_8_ = 0;
        auVar817._0_8_ = uVar876 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar207._8_8_ = 0;
        auVar207._0_8_ = uVar869;
        auVar584._8_8_ = 0;
        auVar584._0_8_ = local_1e8.n[4];
        auVar208._8_8_ = 0;
        auVar208._0_8_ = uVar875;
        auVar585._8_8_ = 0;
        auVar585._0_8_ = local_1e8.n[3];
        auVar209._8_8_ = 0;
        auVar209._0_8_ = uVar870;
        auVar586._8_8_ = 0;
        auVar586._0_8_ = local_1e8.n[2];
        auVar210._8_8_ = 0;
        auVar210._0_8_ = uVar871;
        auVar587._8_8_ = 0;
        auVar587._0_8_ = local_1e8.n[1];
        auVar211._8_8_ = 0;
        auVar211._0_8_ = uVar879;
        auVar588._8_8_ = 0;
        auVar588._0_8_ = local_1e8.n[0];
        auVar212._8_8_ = 0;
        auVar212._0_8_ = uVar872 >> 0x34 | SUB168(auVar205 * auVar583,8) << 0xc;
        auVar181 = auVar207 * auVar584 + auVar817 + auVar208 * auVar585 + auVar209 * auVar586 +
                   auVar210 * auVar587 + auVar211 * auVar588 + auVar212 * ZEXT816(0x1000003d10);
        uVar877 = auVar181._0_8_;
        auVar818._8_8_ = 0;
        auVar818._0_8_ = uVar877 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar213._8_8_ = 0;
        auVar213._0_8_ = uVar869;
        auVar589._8_8_ = 0;
        auVar589._0_8_ = local_1e8.n[0];
        auVar214._8_8_ = 0;
        auVar214._0_8_ = uVar875;
        auVar590._8_8_ = 0;
        auVar590._0_8_ = local_1e8.n[4];
        auVar215._8_8_ = 0;
        auVar215._0_8_ = uVar870;
        auVar591._8_8_ = 0;
        auVar591._0_8_ = local_1e8.n[3];
        auVar216._8_8_ = 0;
        auVar216._0_8_ = uVar871;
        auVar592._8_8_ = 0;
        auVar592._0_8_ = local_1e8.n[2];
        auVar217._8_8_ = 0;
        auVar217._0_8_ = uVar879;
        auVar593._8_8_ = 0;
        auVar593._0_8_ = local_1e8.n[1];
        auVar181 = auVar214 * auVar590 + auVar818 + auVar215 * auVar591 + auVar216 * auVar592 +
                   auVar217 * auVar593;
        uVar872 = auVar181._0_8_;
        auVar820._8_8_ = 0;
        auVar820._0_8_ = uVar872 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar594._8_8_ = 0;
        auVar594._0_8_ = (uVar872 & 0xfffffffffffff) << 4 | (uVar877 & 0xfffffffffffff) >> 0x30;
        auVar181 = auVar213 * auVar589 + ZEXT816(0x1000003d1) * auVar594;
        uVar880 = auVar181._0_8_;
        auVar819._8_8_ = 0;
        auVar819._0_8_ = uVar880 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar218._8_8_ = 0;
        auVar218._0_8_ = uVar869;
        auVar595._8_8_ = 0;
        auVar595._0_8_ = local_1e8.n[1];
        auVar219._8_8_ = 0;
        auVar219._0_8_ = uVar875;
        auVar596._8_8_ = 0;
        auVar596._0_8_ = local_1e8.n[0];
        auVar220._8_8_ = 0;
        auVar220._0_8_ = uVar870;
        auVar597._8_8_ = 0;
        auVar597._0_8_ = local_1e8.n[4];
        auVar221._8_8_ = 0;
        auVar221._0_8_ = uVar871;
        auVar598._8_8_ = 0;
        auVar598._0_8_ = local_1e8.n[3];
        auVar222._8_8_ = 0;
        auVar222._0_8_ = uVar879;
        auVar599._8_8_ = 0;
        auVar599._0_8_ = local_1e8.n[2];
        auVar182 = auVar220 * auVar597 + auVar820 + auVar221 * auVar598 + auVar222 * auVar599;
        uVar872 = auVar182._0_8_;
        auVar223._8_8_ = 0;
        auVar223._0_8_ = uVar872 & 0xfffffffffffff;
        auVar181 = auVar218 * auVar595 + auVar819 + auVar219 * auVar596 +
                   auVar223 * ZEXT816(0x1000003d10);
        uVar881 = auVar181._0_8_;
        auVar822._8_8_ = 0;
        auVar822._0_8_ = uVar872 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar821._8_8_ = 0;
        auVar821._0_8_ = uVar881 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar224._8_8_ = 0;
        auVar224._0_8_ = uVar869;
        auVar600._8_8_ = 0;
        auVar600._0_8_ = local_1e8.n[2];
        auVar225._8_8_ = 0;
        auVar225._0_8_ = uVar875;
        auVar601._8_8_ = 0;
        auVar601._0_8_ = local_1e8.n[1];
        auVar226._8_8_ = 0;
        auVar226._0_8_ = uVar870;
        auVar602._8_8_ = 0;
        auVar602._0_8_ = local_1e8.n[0];
        auVar227._8_8_ = 0;
        auVar227._0_8_ = uVar871;
        auVar603._8_8_ = 0;
        auVar603._0_8_ = local_1e8.n[4];
        auVar228._8_8_ = 0;
        auVar228._0_8_ = uVar879;
        auVar604._8_8_ = 0;
        auVar604._0_8_ = local_1e8.n[3];
        auVar182 = auVar227 * auVar603 + auVar822 + auVar228 * auVar604;
        uVar872 = auVar182._0_8_;
        auVar229._8_8_ = 0;
        auVar229._0_8_ = uVar872 & 0xfffffffffffff;
        auVar181 = auVar224 * auVar600 + auVar821 + auVar225 * auVar601 + auVar226 * auVar602 +
                   auVar229 * ZEXT816(0x1000003d10);
        uVar882 = auVar181._0_8_;
        auVar823._8_8_ = 0;
        auVar823._0_8_ = (uVar882 >> 0x34 | auVar181._8_8_ << 0xc) + (uVar876 & 0xfffffffffffff);
        auVar230._8_8_ = 0;
        auVar230._0_8_ = uVar872 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar823 = auVar230 * ZEXT816(0x1000003d10) + auVar823;
        uVar883 = auVar823._0_8_;
        auVar231._8_8_ = 0;
        auVar231._0_8_ = local_188.n[0];
        auVar605._8_8_ = 0;
        auVar605._0_8_ = uVar871;
        auVar232._8_8_ = 0;
        auVar232._0_8_ = local_188.n[1];
        auVar606._8_8_ = 0;
        auVar606._0_8_ = uVar870;
        auVar233._8_8_ = 0;
        auVar233._0_8_ = local_188.n[2];
        auVar607._8_8_ = 0;
        auVar607._0_8_ = uVar875;
        auVar234._8_8_ = 0;
        auVar234._0_8_ = local_188.n[3];
        auVar608._8_8_ = 0;
        auVar608._0_8_ = uVar869;
        auVar235._8_8_ = 0;
        auVar235._0_8_ = local_188.n[4];
        auVar609._8_8_ = 0;
        auVar609._0_8_ = uVar879;
        uVar872 = SUB168(auVar235 * auVar609,0);
        auVar236._8_8_ = 0;
        auVar236._0_8_ = uVar872 & 0xfffffffffffff;
        auVar181 = auVar232 * auVar606 + auVar231 * auVar605 + auVar233 * auVar607 +
                   auVar234 * auVar608 + auVar236 * ZEXT816(0x1000003d10);
        uVar876 = auVar181._0_8_;
        auVar824._8_8_ = 0;
        auVar824._0_8_ = uVar876 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar237._8_8_ = 0;
        auVar237._0_8_ = local_188.n[0];
        auVar610._8_8_ = 0;
        auVar610._0_8_ = uVar879;
        auVar238._8_8_ = 0;
        auVar238._0_8_ = local_188.n[1];
        auVar611._8_8_ = 0;
        auVar611._0_8_ = uVar871;
        auVar239._8_8_ = 0;
        auVar239._0_8_ = local_188.n[2];
        auVar612._8_8_ = 0;
        auVar612._0_8_ = uVar870;
        auVar240._8_8_ = 0;
        auVar240._0_8_ = local_188.n[3];
        auVar613._8_8_ = 0;
        auVar613._0_8_ = uVar875;
        auVar241._8_8_ = 0;
        auVar241._0_8_ = local_188.n[4];
        auVar614._8_8_ = 0;
        auVar614._0_8_ = uVar869;
        auVar242._8_8_ = 0;
        auVar242._0_8_ = uVar872 >> 0x34 | SUB168(auVar235 * auVar609,8) << 0xc;
        auVar181 = auVar237 * auVar610 + auVar824 + auVar238 * auVar611 + auVar239 * auVar612 +
                   auVar240 * auVar613 + auVar241 * auVar614 + auVar242 * ZEXT816(0x1000003d10);
        uVar872 = auVar181._0_8_;
        auVar825._8_8_ = 0;
        auVar825._0_8_ = uVar872 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar243._8_8_ = 0;
        auVar243._0_8_ = local_188.n[0];
        auVar615._8_8_ = 0;
        auVar615._0_8_ = uVar869;
        auVar244._8_8_ = 0;
        auVar244._0_8_ = local_188.n[1];
        auVar616._8_8_ = 0;
        auVar616._0_8_ = uVar879;
        auVar245._8_8_ = 0;
        auVar245._0_8_ = local_188.n[2];
        auVar617._8_8_ = 0;
        auVar617._0_8_ = uVar871;
        auVar246._8_8_ = 0;
        auVar246._0_8_ = local_188.n[3];
        auVar618._8_8_ = 0;
        auVar618._0_8_ = uVar870;
        auVar247._8_8_ = 0;
        auVar247._0_8_ = local_188.n[4];
        auVar619._8_8_ = 0;
        auVar619._0_8_ = uVar875;
        auVar181 = auVar244 * auVar616 + auVar825 + auVar245 * auVar617 + auVar246 * auVar618 +
                   auVar247 * auVar619;
        uVar878 = auVar181._0_8_;
        auVar827._8_8_ = 0;
        auVar827._0_8_ = uVar878 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar620._8_8_ = 0;
        auVar620._0_8_ = (uVar878 & 0xfffffffffffff) << 4 | (uVar872 & 0xfffffffffffff) >> 0x30;
        auVar181 = auVar243 * auVar615 + ZEXT816(0x1000003d1) * auVar620;
        uVar884 = auVar181._0_8_;
        auVar826._8_8_ = 0;
        auVar826._0_8_ = uVar884 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar248._8_8_ = 0;
        auVar248._0_8_ = local_188.n[0];
        auVar621._8_8_ = 0;
        auVar621._0_8_ = uVar875;
        auVar249._8_8_ = 0;
        auVar249._0_8_ = local_188.n[1];
        auVar622._8_8_ = 0;
        auVar622._0_8_ = uVar869;
        auVar250._8_8_ = 0;
        auVar250._0_8_ = local_188.n[2];
        auVar623._8_8_ = 0;
        auVar623._0_8_ = uVar879;
        auVar251._8_8_ = 0;
        auVar251._0_8_ = local_188.n[3];
        auVar624._8_8_ = 0;
        auVar624._0_8_ = uVar871;
        auVar252._8_8_ = 0;
        auVar252._0_8_ = local_188.n[4];
        auVar625._8_8_ = 0;
        auVar625._0_8_ = uVar870;
        auVar182 = auVar250 * auVar623 + auVar827 + auVar251 * auVar624 + auVar252 * auVar625;
        uVar878 = auVar182._0_8_;
        auVar253._8_8_ = 0;
        auVar253._0_8_ = uVar878 & 0xfffffffffffff;
        auVar181 = auVar248 * auVar621 + auVar826 + auVar249 * auVar622 +
                   auVar253 * ZEXT816(0x1000003d10);
        uVar885 = auVar181._0_8_;
        auVar829._8_8_ = 0;
        auVar829._0_8_ = uVar878 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar828._8_8_ = 0;
        auVar828._0_8_ = uVar885 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar254._8_8_ = 0;
        auVar254._0_8_ = local_188.n[0];
        auVar626._8_8_ = 0;
        auVar626._0_8_ = uVar870;
        auVar255._8_8_ = 0;
        auVar255._0_8_ = local_188.n[1];
        auVar627._8_8_ = 0;
        auVar627._0_8_ = uVar875;
        auVar256._8_8_ = 0;
        auVar256._0_8_ = local_188.n[2];
        auVar628._8_8_ = 0;
        auVar628._0_8_ = uVar869;
        auVar257._8_8_ = 0;
        auVar257._0_8_ = local_188.n[3];
        auVar629._8_8_ = 0;
        auVar629._0_8_ = uVar879;
        auVar258._8_8_ = 0;
        auVar258._0_8_ = local_188.n[4];
        auVar630._8_8_ = 0;
        auVar630._0_8_ = uVar871;
        auVar182 = auVar257 * auVar629 + auVar829 + auVar258 * auVar630;
        uVar870 = auVar182._0_8_;
        auVar259._8_8_ = 0;
        auVar259._0_8_ = uVar870 & 0xfffffffffffff;
        auVar181 = auVar254 * auVar626 + auVar828 + auVar255 * auVar627 + auVar256 * auVar628 +
                   auVar259 * ZEXT816(0x1000003d10);
        uVar869 = auVar181._0_8_;
        auVar830._8_8_ = 0;
        auVar830._0_8_ = (uVar869 >> 0x34 | auVar181._8_8_ << 0xc) + (uVar876 & 0xfffffffffffff);
        auVar260._8_8_ = 0;
        auVar260._0_8_ = uVar870 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar830 = auVar260 * ZEXT816(0x1000003d10) + auVar830;
        uVar875 = auVar830._0_8_;
        local_d8 = (uVar884 & 0xfffffffffffff) * 4 + 0x1c;
        uVar870 = (uVar880 & 0xfffffffffffff) * 3 + local_d8;
        local_d0 = (uVar885 & 0xfffffffffffff) * 4;
        uStack_c8 = (uVar869 & 0xfffffffffffff) * 4;
        uVar878 = (uVar881 & 0xfffffffffffff) * 3 + local_d0;
        uVar879 = (uVar882 & 0xfffffffffffff) * 3 + uStack_c8;
        local_c0 = (uVar875 & 0xfffffffffffff) * 4;
        uStack_b8 = ((uVar875 >> 0x34 | auVar830._8_8_ << 0xc) + (uVar872 & 0xffffffffffff)) * 4;
        uVar876 = local_c0 + (uVar883 & 0xfffffffffffff) * 3;
        uVar877 = uStack_b8 +
                  ((uVar883 >> 0x34 | auVar823._8_8_ << 0xc) + (uVar877 & 0xffffffffffff)) * 3;
        auVar261._8_8_ = 0;
        auVar261._0_8_ = local_1e8.n[0];
        auVar631._8_8_ = 0;
        auVar631._0_8_ = uVar876;
        auVar262._8_8_ = 0;
        auVar262._0_8_ = local_1e8.n[1];
        auVar632._8_8_ = 0;
        auVar632._0_8_ = uVar879;
        auVar263._8_8_ = 0;
        auVar263._0_8_ = local_1e8.n[2];
        auVar633._8_8_ = 0;
        auVar633._0_8_ = uVar878;
        auVar264._8_8_ = 0;
        auVar264._0_8_ = local_1e8.n[3];
        auVar634._8_8_ = 0;
        auVar634._0_8_ = uVar870;
        auVar265._8_8_ = 0;
        auVar265._0_8_ = local_1e8.n[4];
        auVar635._8_8_ = 0;
        auVar635._0_8_ = uVar877;
        uVar869 = SUB168(auVar265 * auVar635,0);
        auVar266._8_8_ = 0;
        auVar266._0_8_ = uVar869 & 0xfffffffffffff;
        auVar181 = auVar262 * auVar632 + auVar261 * auVar631 + auVar263 * auVar633 +
                   auVar264 * auVar634 + auVar266 * ZEXT816(0x1000003d10);
        uVar875 = auVar181._0_8_;
        local_120.n[0] = uVar875 & 0xfffffffffffff;
        auVar831._8_8_ = 0;
        auVar831._0_8_ = uVar875 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar267._8_8_ = 0;
        auVar267._0_8_ = local_1e8.n[0];
        auVar636._8_8_ = 0;
        auVar636._0_8_ = uVar877;
        auVar268._8_8_ = 0;
        auVar268._0_8_ = local_1e8.n[1];
        auVar637._8_8_ = 0;
        auVar637._0_8_ = uVar876;
        auVar269._8_8_ = 0;
        auVar269._0_8_ = local_1e8.n[2];
        auVar638._8_8_ = 0;
        auVar638._0_8_ = uVar879;
        auVar270._8_8_ = 0;
        auVar270._0_8_ = local_1e8.n[3];
        auVar639._8_8_ = 0;
        auVar639._0_8_ = uVar878;
        auVar271._8_8_ = 0;
        auVar271._0_8_ = local_1e8.n[4];
        auVar640._8_8_ = 0;
        auVar640._0_8_ = uVar870;
        auVar272._8_8_ = 0;
        auVar272._0_8_ = uVar869 >> 0x34 | SUB168(auVar265 * auVar635,8) << 0xc;
        auVar181 = auVar267 * auVar636 + auVar831 + auVar268 * auVar637 + auVar269 * auVar638 +
                   auVar270 * auVar639 + auVar271 * auVar640 + auVar272 * ZEXT816(0x1000003d10);
        uVar869 = auVar181._0_8_;
        auVar832._8_8_ = 0;
        auVar832._0_8_ = uVar869 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar273._8_8_ = 0;
        auVar273._0_8_ = local_1e8.n[0];
        auVar641._8_8_ = 0;
        auVar641._0_8_ = uVar870;
        auVar274._8_8_ = 0;
        auVar274._0_8_ = local_1e8.n[1];
        auVar642._8_8_ = 0;
        auVar642._0_8_ = uVar877;
        auVar275._8_8_ = 0;
        auVar275._0_8_ = local_1e8.n[2];
        auVar643._8_8_ = 0;
        auVar643._0_8_ = uVar876;
        auVar276._8_8_ = 0;
        auVar276._0_8_ = local_1e8.n[3];
        auVar644._8_8_ = 0;
        auVar644._0_8_ = uVar879;
        auVar277._8_8_ = 0;
        auVar277._0_8_ = local_1e8.n[4];
        auVar645._8_8_ = 0;
        auVar645._0_8_ = uVar878;
        auVar181 = auVar274 * auVar642 + auVar832 + auVar275 * auVar643 + auVar276 * auVar644 +
                   auVar277 * auVar645;
        uVar875 = auVar181._0_8_;
        auVar834._8_8_ = 0;
        auVar834._0_8_ = uVar875 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar646._8_8_ = 0;
        auVar646._0_8_ = (uVar875 & 0xfffffffffffff) << 4 | (uVar869 & 0xfffffffffffff) >> 0x30;
        auVar181 = auVar273 * auVar641 + ZEXT816(0x1000003d1) * auVar646;
        uVar871 = auVar181._0_8_;
        auVar833._8_8_ = 0;
        auVar833._0_8_ = uVar871 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar278._8_8_ = 0;
        auVar278._0_8_ = local_1e8.n[0];
        auVar647._8_8_ = 0;
        auVar647._0_8_ = uVar878;
        auVar279._8_8_ = 0;
        auVar279._0_8_ = local_1e8.n[1];
        auVar648._8_8_ = 0;
        auVar648._0_8_ = uVar870;
        auVar280._8_8_ = 0;
        auVar280._0_8_ = local_1e8.n[2];
        auVar649._8_8_ = 0;
        auVar649._0_8_ = uVar877;
        auVar281._8_8_ = 0;
        auVar281._0_8_ = local_1e8.n[3];
        auVar650._8_8_ = 0;
        auVar650._0_8_ = uVar876;
        auVar282._8_8_ = 0;
        auVar282._0_8_ = local_1e8.n[4];
        auVar651._8_8_ = 0;
        auVar651._0_8_ = uVar879;
        auVar182 = auVar280 * auVar649 + auVar834 + auVar281 * auVar650 + auVar282 * auVar651;
        uVar875 = auVar182._0_8_;
        auVar283._8_8_ = 0;
        auVar283._0_8_ = uVar875 & 0xfffffffffffff;
        auVar181 = auVar278 * auVar647 + auVar833 + auVar279 * auVar648 +
                   auVar283 * ZEXT816(0x1000003d10);
        uVar872 = auVar181._0_8_;
        auVar836._8_8_ = 0;
        auVar836._0_8_ = uVar875 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar835._8_8_ = 0;
        auVar835._0_8_ = uVar872 >> 0x34 | auVar181._8_8_ << 0xc;
        auVar284._8_8_ = 0;
        auVar284._0_8_ = local_1e8.n[0];
        auVar652._8_8_ = 0;
        auVar652._0_8_ = uVar879;
        auVar285._8_8_ = 0;
        auVar285._0_8_ = local_1e8.n[1];
        auVar653._8_8_ = 0;
        auVar653._0_8_ = uVar878;
        auVar286._8_8_ = 0;
        auVar286._0_8_ = local_1e8.n[2];
        auVar654._8_8_ = 0;
        auVar654._0_8_ = uVar870;
        auVar287._8_8_ = 0;
        auVar287._0_8_ = local_1e8.n[3];
        auVar655._8_8_ = 0;
        auVar655._0_8_ = uVar877;
        auVar288._8_8_ = 0;
        auVar288._0_8_ = local_1e8.n[4];
        auVar656._8_8_ = 0;
        auVar656._0_8_ = uVar876;
        auVar182 = auVar287 * auVar655 + auVar836 + auVar288 * auVar656;
        uVar870 = auVar182._0_8_;
        auVar289._8_8_ = 0;
        auVar289._0_8_ = uVar870 & 0xfffffffffffff;
        auVar181 = auVar284 * auVar652 + auVar835 + auVar285 * auVar653 + auVar286 * auVar654 +
                   auVar289 * ZEXT816(0x1000003d10);
        uVar875 = auVar181._0_8_;
        auVar837._8_8_ = 0;
        auVar837._0_8_ = (uVar875 >> 0x34 | auVar181._8_8_ << 0xc) + local_120.n[0];
        auVar290._8_8_ = 0;
        auVar290._0_8_ = uVar870 >> 0x34 | auVar182._8_8_ << 0xc;
        auVar837 = auVar290 * ZEXT816(0x1000003d10) + auVar837;
        uVar870 = auVar837._0_8_;
        local_1b8.n[0] = 0x3ffffbfffff0bc - (uVar871 & 0xfffffffffffff);
        local_1b8.n[1] = 0x3ffffffffffffc - (uVar872 & 0xfffffffffffff);
        local_1b8.n[2] = 0x3ffffffffffffc - (uVar875 & 0xfffffffffffff);
        local_1b8.n[3] = 0x3ffffffffffffc - (uVar870 & 0xfffffffffffff);
        local_1b8.n[4] =
             0x3fffffffffffc -
             ((uVar870 >> 0x34 | auVar837._8_8_ << 0xc) + (uVar869 & 0xffffffffffff));
        iVar868 = secp256k1_fe_impl_is_square_var(&local_1b8);
        if (iVar868 != 0) {
          secp256k1_fe_sqrt(&local_80,&local_1b8);
          if ((local_1bc & 1) != 0) {
            iVar868 = secp256k1_fe_impl_normalizes_to_zero_var(&local_80);
            if (iVar868 != 0) goto LAB_0011139b;
          }
          iVar868 = secp256k1_fe_impl_normalizes_to_zero_var(&local_1e8);
          if (iVar868 == 0) {
            secp256k1_fe_impl_inv_var(&local_a8,&local_1e8);
            auVar291._8_8_ = 0;
            auVar291._0_8_ = local_80.n[0];
            auVar657._8_8_ = 0;
            auVar657._0_8_ = local_a8.n[3];
            auVar292._8_8_ = 0;
            auVar292._0_8_ = local_80.n[1];
            auVar658._8_8_ = 0;
            auVar658._0_8_ = local_a8.n[2];
            auVar293._8_8_ = 0;
            auVar293._0_8_ = local_80.n[2];
            auVar659._8_8_ = 0;
            auVar659._0_8_ = local_a8.n[1];
            auVar294._8_8_ = 0;
            auVar294._0_8_ = local_80.n[3];
            auVar660._8_8_ = 0;
            auVar660._0_8_ = local_a8.n[0];
            auVar295._8_8_ = 0;
            auVar295._0_8_ = local_80.n[4];
            auVar661._8_8_ = 0;
            auVar661._0_8_ = local_a8.n[4];
            uVar870 = SUB168(auVar295 * auVar661,0);
            auVar296._8_8_ = 0;
            auVar296._0_8_ = uVar870 & 0xfffffffffffff;
            auVar291 = auVar292 * auVar658 + auVar291 * auVar657 + auVar293 * auVar659 +
                       auVar294 * auVar660 + auVar296 * ZEXT816(0x1000003d10);
            uVar869 = auVar291._0_8_;
            local_120.n[0] = uVar869 & 0xfffffffffffff;
            auVar838._8_8_ = 0;
            auVar838._0_8_ = uVar869 >> 0x34 | auVar291._8_8_ << 0xc;
            auVar297._8_8_ = 0;
            auVar297._0_8_ = local_80.n[0];
            auVar662._8_8_ = 0;
            auVar662._0_8_ = local_a8.n[4];
            auVar298._8_8_ = 0;
            auVar298._0_8_ = local_80.n[1];
            auVar663._8_8_ = 0;
            auVar663._0_8_ = local_a8.n[3];
            auVar299._8_8_ = 0;
            auVar299._0_8_ = local_80.n[2];
            auVar664._8_8_ = 0;
            auVar664._0_8_ = local_a8.n[2];
            auVar300._8_8_ = 0;
            auVar300._0_8_ = local_80.n[3];
            auVar665._8_8_ = 0;
            auVar665._0_8_ = local_a8.n[1];
            auVar301._8_8_ = 0;
            auVar301._0_8_ = local_80.n[4];
            auVar666._8_8_ = 0;
            auVar666._0_8_ = local_a8.n[0];
            auVar302._8_8_ = 0;
            auVar302._0_8_ = uVar870 >> 0x34 | SUB168(auVar295 * auVar661,8) << 0xc;
            auVar291 = auVar297 * auVar662 + auVar838 + auVar298 * auVar663 + auVar299 * auVar664 +
                       auVar300 * auVar665 + auVar301 * auVar666 + auVar302 * ZEXT816(0x1000003d10);
            uVar869 = auVar291._0_8_;
            auVar839._8_8_ = 0;
            auVar839._0_8_ = uVar869 >> 0x34 | auVar291._8_8_ << 0xc;
            auVar303._8_8_ = 0;
            auVar303._0_8_ = local_80.n[0];
            auVar667._8_8_ = 0;
            auVar667._0_8_ = local_a8.n[0];
            auVar304._8_8_ = 0;
            auVar304._0_8_ = local_80.n[1];
            auVar668._8_8_ = 0;
            auVar668._0_8_ = local_a8.n[4];
            auVar305._8_8_ = 0;
            auVar305._0_8_ = local_80.n[2];
            auVar669._8_8_ = 0;
            auVar669._0_8_ = local_a8.n[3];
            auVar306._8_8_ = 0;
            auVar306._0_8_ = local_80.n[3];
            auVar670._8_8_ = 0;
            auVar670._0_8_ = local_a8.n[2];
            auVar307._8_8_ = 0;
            auVar307._0_8_ = local_80.n[4];
            auVar671._8_8_ = 0;
            auVar671._0_8_ = local_a8.n[1];
            auVar291 = auVar304 * auVar668 + auVar839 + auVar305 * auVar669 + auVar306 * auVar670 +
                       auVar307 * auVar671;
            uVar870 = auVar291._0_8_;
            auVar841._8_8_ = 0;
            auVar841._0_8_ = uVar870 >> 0x34 | auVar291._8_8_ << 0xc;
            auVar672._8_8_ = 0;
            auVar672._0_8_ = (uVar870 & 0xfffffffffffff) << 4 | (uVar869 & 0xfffffffffffff) >> 0x30;
            auVar291 = auVar303 * auVar667 + ZEXT816(0x1000003d1) * auVar672;
            uVar875 = auVar291._0_8_;
            auVar840._8_8_ = 0;
            auVar840._0_8_ = uVar875 >> 0x34 | auVar291._8_8_ << 0xc;
            auVar308._8_8_ = 0;
            auVar308._0_8_ = local_80.n[0];
            auVar673._8_8_ = 0;
            auVar673._0_8_ = local_a8.n[1];
            auVar309._8_8_ = 0;
            auVar309._0_8_ = local_80.n[1];
            auVar674._8_8_ = 0;
            auVar674._0_8_ = local_a8.n[0];
            auVar310._8_8_ = 0;
            auVar310._0_8_ = local_80.n[2];
            auVar675._8_8_ = 0;
            auVar675._0_8_ = local_a8.n[4];
            auVar311._8_8_ = 0;
            auVar311._0_8_ = local_80.n[3];
            auVar676._8_8_ = 0;
            auVar676._0_8_ = local_a8.n[3];
            auVar312._8_8_ = 0;
            auVar312._0_8_ = local_80.n[4];
            auVar677._8_8_ = 0;
            auVar677._0_8_ = local_a8.n[2];
            auVar181 = auVar310 * auVar675 + auVar841 + auVar311 * auVar676 + auVar312 * auVar677;
            uVar870 = auVar181._0_8_;
            auVar313._8_8_ = 0;
            auVar313._0_8_ = uVar870 & 0xfffffffffffff;
            auVar291 = auVar308 * auVar673 + auVar840 + auVar309 * auVar674 +
                       auVar313 * ZEXT816(0x1000003d10);
            uVar871 = auVar291._0_8_;
            auVar843._8_8_ = 0;
            auVar843._0_8_ = uVar870 >> 0x34 | auVar181._8_8_ << 0xc;
            auVar842._8_8_ = 0;
            auVar842._0_8_ = uVar871 >> 0x34 | auVar291._8_8_ << 0xc;
            auVar314._8_8_ = 0;
            auVar314._0_8_ = local_80.n[0];
            auVar678._8_8_ = 0;
            auVar678._0_8_ = local_a8.n[2];
            auVar315._8_8_ = 0;
            auVar315._0_8_ = local_80.n[1];
            auVar679._8_8_ = 0;
            auVar679._0_8_ = local_a8.n[1];
            auVar316._8_8_ = 0;
            auVar316._0_8_ = local_80.n[2];
            auVar680._8_8_ = 0;
            auVar680._0_8_ = local_a8.n[0];
            auVar317._8_8_ = 0;
            auVar317._0_8_ = local_80.n[3];
            auVar681._8_8_ = 0;
            auVar681._0_8_ = local_a8.n[4];
            auVar318._8_8_ = 0;
            auVar318._0_8_ = local_80.n[4];
            auVar682._8_8_ = 0;
            auVar682._0_8_ = local_a8.n[3];
            auVar181 = auVar317 * auVar681 + auVar843 + auVar318 * auVar682;
            uVar870 = auVar181._0_8_;
            auVar319._8_8_ = 0;
            auVar319._0_8_ = uVar870 & 0xfffffffffffff;
            auVar291 = auVar314 * auVar678 + auVar842 + auVar315 * auVar679 + auVar316 * auVar680 +
                       auVar319 * ZEXT816(0x1000003d10);
            uVar876 = auVar291._0_8_;
            auVar844._8_8_ = 0;
            auVar844._0_8_ = (uVar876 >> 0x34 | auVar291._8_8_ << 0xc) + local_120.n[0];
            auVar320._8_8_ = 0;
            auVar320._0_8_ = uVar870 >> 0x34 | auVar181._8_8_ << 0xc;
            auVar844 = auVar320 * ZEXT816(0x1000003d10) + auVar844;
            uVar877 = auVar844._0_8_;
            lVar886 = (uVar875 & 0xfffffffffffff) + local_218.n[0];
            uVar870 = -(ulong)((uint)lVar886 & 1);
            uVar878 = uVar870 >> 0xc;
            uVar872 = (uVar871 & 0xfffffffffffff) + local_218.n[1] + uVar878;
            uVar871 = (uVar876 & 0xfffffffffffff) + local_218.n[2] + uVar878;
            uVar875 = (uVar877 & 0xfffffffffffff) + local_218.n[3] + uVar878;
            local_a8.n[4] =
                 (uVar870 >> 0x10) +
                 (uVar877 >> 0x34 | auVar844._8_8_ << 0xc) + (uVar869 & 0xffffffffffff) +
                 local_218.n[4];
            local_a8.n[0] =
                 ((ulong)((uint)uVar872 & 1) << 0x33) + ((uVar878 & 0xffffefffffc2f) + lVar886 >> 1)
            ;
            local_a8.n[1] = ((ulong)((uint)uVar871 & 1) << 0x33) + (uVar872 >> 1);
            local_a8.n[2] = ((ulong)((uint)uVar875 & 1) << 0x33) + (uVar871 >> 1);
            local_a8.n[3] = ((ulong)((uint)local_a8.n[4] & 1) << 0x33) + (uVar875 >> 1);
            local_a8.n[4] = local_a8.n[4] >> 1;
            goto LAB_001117a5;
          }
        }
      }
    }
LAB_0011139b:
    uVar870 = (ulong)((int)local_e0 + 1);
  } while( true );
}

Assistant:

static void secp256k1_ellswift_elligatorswift_var(unsigned char *u32, secp256k1_fe *t, const secp256k1_ge *p, const secp256k1_sha256 *hasher) {
    secp256k1_ellswift_xelligatorswift_var(u32, t, &p->x, hasher);
    secp256k1_fe_normalize_var(t);
    if (secp256k1_fe_is_odd(t) != secp256k1_fe_is_odd(&p->y)) {
        secp256k1_fe_negate(t, t, 1);
        secp256k1_fe_normalize_var(t);
    }
}